

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_linalg.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  DstEvaluatorType *pDVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined4 uVar54;
  uint uVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  long lVar64;
  ostream *poVar65;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar66;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *pCVar67;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_> *pCVar68;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *pCVar69;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  Index size;
  double *pdVar70;
  char *pcVar71;
  Index index_1;
  ActualDstType actualDst;
  ulong uVar72;
  ulong uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [24];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  gVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  Scalar SVar83;
  Scalar SVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  ChMatrixDynamic<> M2;
  ChMatrixDynamic<> Md1;
  ChMatrixDynamic<> Md2;
  ChMatrixDynamic<> M1;
  SrcEvaluatorType srcEvaluator_1;
  ChMatrixNM<double,_4,_4> Ms;
  ChMatrixDynamic<double> CD_t;
  DstEvaluatorType dstEvaluator_2;
  ChMatrixDynamic<> M3;
  ChMatrixDynamic<> D;
  ChMatrixDynamic<double> CD;
  ChVector<double> v_1;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_680;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  assign_op<double,_double> local_619;
  double local_618;
  double local_610;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *local_608;
  undefined1 local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined1 auStack_5e0 [16];
  double dStack_5d0;
  double dStack_5c8;
  undefined1 local_5c0 [16];
  double dStack_5b0;
  double dStack_5a8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_5a0;
  double local_580;
  double dStack_578;
  double dStack_570;
  double dStack_568;
  double local_560;
  double dStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_540;
  double *pdStack_520;
  double *pdStack_518;
  undefined4 uStack_510;
  uint uStack_50c;
  undefined4 uStack_508;
  uint uStack_504;
  double local_500;
  ulong local_4f8;
  undefined8 local_4f0;
  ulong local_4e8;
  undefined8 local_4e0;
  ulong local_4d8;
  ulong uStack_4d0;
  undefined8 local_4c8;
  double local_490;
  SrcEvaluatorType local_482;
  undefined1 local_480 [64];
  undefined1 local_440 [104];
  double dStack_3d8;
  ulong uStack_3d0;
  ulong uStack_3c8;
  long local_3c0;
  double dStack_3b8;
  double dStack_3b0;
  double dStack_3a8;
  double dStack_3a0;
  double dStack_398;
  double dStack_390;
  double dStack_388;
  double dStack_380;
  double dStack_378;
  ulong local_370;
  RealScalar local_368;
  RealScalar RStack_360;
  Index IStack_358;
  Index IStack_350;
  undefined8 uStack_348;
  undefined8 uStack_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  Scalar local_308;
  double local_300;
  double local_2f8;
  double local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  double local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined1 local_2c0 [64];
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  plainobjectbase_evaluator_data<double,_3> local_228;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_220;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [64];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [16];
  double dStack_f0;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  ChVector<double> local_90 [4];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n=== Creation and assignment ===\n",0x21);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  local_600 = ZEXT816(0);
  auStack_5f0._0_8_ = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)local_600,0x23,5,7);
  local_5a0.m_dst = (DstEvaluatorType *)0x0;
  local_5a0.m_src = (SrcEvaluatorType *)0x0;
  local_5a0.m_functor = (assign_op<double,_double> *)0x0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)&local_5a0,0x10,4,4);
  lVar64 = 0;
  do {
    *(undefined8 *)(local_440 + lVar64) = 0x3fb999999999999a;
    lVar64 = lVar64 + 8;
  } while (lVar64 != 0x80);
  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)local_440);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
  std::ostream::put((char)poVar65);
  std::ostream::flush();
  local_540.m_dst = (DstEvaluatorType *)local_600._8_8_;
  local_540.m_src = (SrcEvaluatorType *)auStack_5f0._0_8_;
  if ((long)(auStack_5f0._0_8_ | local_600._8_8_) < 0) {
LAB_00107b3d:
    pcVar71 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
    ;
  }
  else {
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)local_600,
               (CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                *)&local_540,(assign_op<double,_double> *)&local_680);
    Eigen::internal::
    inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_false,_false>::run
              ((Matrix<double,__1,__1,_1,__1,__1> *)local_600);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)local_600,4,2,2);
    local_540.m_dst = (DstEvaluatorType *)local_600._8_8_;
    local_540.m_src = (SrcEvaluatorType *)auStack_5f0._0_8_;
    local_540.m_functor = (assign_op<double,_double> *)0x0;
    if (-1 < (long)(auStack_5f0._0_8_ | local_600._8_8_)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Matrix<double,__1,__1,_1,__1,__1> *)local_600,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                  *)&local_540,(assign_op<double,_double> *)&local_680);
      local_540.m_dst = (DstEvaluatorType *)local_5a0.m_src;
      local_540.m_src = (SrcEvaluatorType *)local_5a0.m_functor;
      if ((long)((ulong)local_5a0.m_functor | (ulong)local_5a0.m_src) < 0) {
        pcVar71 = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
        ;
        goto LAB_00107c43;
      }
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_1,__1,__1> *)&local_5a0,
                 (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                  *)&local_540,(assign_op<double,_double> *)&local_680);
      if (-1 < (long)((ulong)local_5a0.m_functor | (ulong)local_5a0.m_src)) {
        uVar72 = (long)local_5a0.m_functor * (long)local_5a0.m_src;
        uVar73 = uVar72 + 7;
        if (-1 < (long)uVar72) {
          uVar73 = uVar72;
        }
        uVar73 = uVar73 & 0xfffffffffffffff8;
        if (7 < (long)uVar72) {
          lVar64 = 0;
          auVar81 = vbroadcastsd_avx512f(ZEXT816(0x4008000000000000));
          do {
            auVar82 = vmulpd_avx512f(auVar81,*(undefined1 (*) [64])(local_5a0.m_dst + lVar64));
            *(undefined1 (*) [64])(local_5a0.m_dst + lVar64) = auVar82;
            lVar64 = lVar64 + 8;
          } while (lVar64 < (long)uVar73);
        }
        if ((long)uVar73 < (long)uVar72) {
          do {
            local_5a0.m_dst[uVar73].
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.data
                 = (double *)
                   ((double)local_5a0.m_dst[uVar73].
                            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                            .m_d.data * 3.0);
            uVar73 = uVar73 + 1;
          } while (uVar72 - uVar73 != 0);
        }
        if ((((((long)local_5a0.m_src < 1) || ((long)local_5a0.m_functor < 1)) ||
             (((local_5a0.m_dst)->
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>).m_d.
              data = (double *)0x4024000000000000, (long)local_5a0.m_src < 2)) ||
            (((long)local_5a0.m_functor < 2 || ((long)local_5a0.m_functor < 3)))) ||
           (local_5a0.m_dst[(long)((long)&(local_5a0.m_functor)->field_0x0 + 2)].
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.data
                 = (double *)
                   ((double)local_5a0.m_dst[(long)((long)&(local_5a0.m_functor)->field_0x0 + 1)].
                            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                            .m_d.data + 10.0), (long)local_5a0.m_src < 3)) {
LAB_00107b01:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                       );
        }
        local_5a0.m_dst[(long)local_5a0.m_functor * 2 + 2].
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.data =
             (double *)0x4010000000000000;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::DenseStorage
                  ((DenseStorage<double,__1,__1,__1,_1> *)&local_540,
                   (DenseStorage<double,__1,__1,__1,_1> *)&local_5a0);
        local_680._0_16_ = ZEXT816(0);
        local_680.m_functor = (assign_op<double,_double> *)0x0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                  ((DenseStorage<double,__1,__1,__1,_1> *)&local_680,0x10,4,4);
        gVar78 = local_220;
        if ((local_680.m_src != (SrcEvaluatorType *)0x4) ||
           (local_680.m_functor != (assign_op<double,_double> *)0x4)) {
          pcVar71 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 4, 4, 1>>, T1 = double, T2 = double]"
          ;
          goto LAB_00107ce0;
        }
        lVar64 = 0;
        do {
          auVar81 = vsubpd_avx512f(ZEXT864(0) << 0x40,*(undefined1 (*) [64])(local_440 + lVar64 * 8)
                                  );
          *(undefined1 (*) [64])(local_680.m_dst + lVar64) = auVar81;
          lVar64 = lVar64 + 8;
        } while (lVar64 == 8);
        local_220._0_16_ = ZEXT816(0);
        local_220.m_dstExpr = gVar78.m_dstExpr;
        local_220.m_functor = (assign_op<double,_double> *)0x0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                  ((DenseStorage<double,__1,__1,__1,_1> *)&local_220,0x20,8,4);
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,__1,_1,__1,__1> *)&local_220,
                   (Matrix<double,__1,__1,_1,__1,__1> *)&local_540,
                   (assign_op<double,_double> *)&local_160);
        local_160.m_dst = (DstEvaluatorType *)&local_540;
        Eigen::internal::
        check_for_aliasing<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
                  ((Matrix<double,__1,__1,_1,__1,__1> *)&local_220,
                   (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_160);
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
                  ((Matrix<double,__1,__1,_1,__1,__1> *)&local_220,
                   (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_160,
                   (assign_op<double,_double> *)local_100);
        if (local_220.m_dst != (DstEvaluatorType *)0x0) {
          free(local_220.m_dst[-1].
               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
               data);
        }
        if (local_680.m_dst != (DstEvaluatorType *)0x0) {
          free(local_680.m_dst[-1].
               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
               data);
        }
        if ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_540.m_dst !=
            (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)0x0) {
          free(((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                 *)((long)local_540.m_dst + -0x20))->m_dstExpr);
        }
        if (local_5a0.m_dst != (DstEvaluatorType *)0x0) {
          free(local_5a0.m_dst[-1].
               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
               data);
        }
        if ((plainobjectbase_evaluator_data<double,_3>)local_600._0_8_ !=
            (plainobjectbase_evaluator_data<double,_3>)0x0) {
          free(*(void **)(local_600._0_8_ + -8));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\n=== Matrix operations ===\n",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
        std::ostream::put(-0x78);
        std::ostream::flush();
        local_5a0.m_dst = (DstEvaluatorType *)0x0;
        local_5a0.m_src = (SrcEvaluatorType *)0x0;
        local_5a0.m_functor = (assign_op<double,_double> *)0x0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                  ((DenseStorage<double,__1,__1,__1,_1> *)&local_5a0,6,2,3);
        iVar59 = rand();
        local_540.m_dst =
             (DstEvaluatorType *)(((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0);
        iVar59 = rand();
        local_540.m_src =
             (SrcEvaluatorType *)(((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0);
        iVar59 = rand();
        local_540.m_functor =
             (assign_op<double,_double> *)(((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0);
        iVar59 = rand();
        local_540.m_dstExpr =
             (DstXprType *)(((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0);
        iVar59 = rand();
        pdStack_520 = (double *)(((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0);
        iVar59 = rand();
        pdStack_518 = (double *)(((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0);
        local_440._0_8_ = local_5a0.m_src;
        local_440._8_8_ = local_5a0.m_functor;
        if (-1 < (long)((ulong)local_5a0.m_functor | (ulong)local_5a0.m_src)) {
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_1,__1,__1> *)&local_5a0,
                     (CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                      *)local_440,(assign_op<double,_double> *)local_600);
          pDVar1 = local_5a0.m_dst;
          gVar78 = local_680;
          if (((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                *)local_5a0.m_src ==
               (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                *)0x2) &&
             ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)local_5a0.m_functor ==
              (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)0x3)) {
            local_680._0_16_ = ZEXT816(0);
            local_680.m_dstExpr = gVar78.m_dstExpr;
            local_680.m_functor = (assign_op<double,_double> *)0x0;
            Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                      ((DenseStorage<double,__1,__1,__1,_1> *)&local_680,6,2,3);
            if ((local_680.m_src != (SrcEvaluatorType *)0x2) ||
               (local_680.m_functor != (assign_op<double,_double> *)0x3)) {
              pcVar71 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, 2, 3, 1>, const Eigen::Matrix<double, -1, -1, 1>>, T1 = double, T2 = double]"
              ;
              goto LAB_00107ce0;
            }
            lVar64 = 0;
            do {
              local_680.m_dst[lVar64].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)
                     ((double)(&local_540.m_dst)[lVar64] +
                     (double)pDVar1[lVar64].
                             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                             .m_d.data);
              lVar64 = lVar64 + 1;
            } while (lVar64 != 6);
            if (((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                  *)local_5a0.m_src ==
                 (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                  *)0x2) &&
               ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                 *)local_5a0.m_functor ==
                (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                 *)0x3)) {
              lVar64 = 0;
              do {
                local_680.m_dst[lVar64].
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
                data = (double *)
                       ((double)(&local_540.m_dst)[lVar64] +
                       (double)local_5a0.m_dst[lVar64].
                               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                               .m_d.data);
                lVar64 = lVar64 + 1;
              } while (lVar64 != 6);
              local_680.m_dst[2].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_functor;
              local_680.m_dst[3].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_dstExpr;
              local_680.m_dst[4].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = pdStack_520;
              local_680.m_dst[5].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = pdStack_518;
              ((local_680.m_dst)->
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>).m_d.
              data = (double *)local_540.m_dst;
              local_680.m_dst[1].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_src;
              local_680.m_dst[2].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_functor;
              local_680.m_dst[3].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_dstExpr;
              lVar64 = 0;
              do {
                local_680.m_dst[lVar64].
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
                data = (double *)
                       ((double)local_5a0.m_dst[lVar64].
                                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                .m_d.data +
                       (double)local_680.m_dst[lVar64].
                               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                               .m_d.data);
                lVar64 = lVar64 + 1;
              } while (lVar64 != 6);
              lVar64 = 0;
              do {
                local_680.m_dst[lVar64].
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
                data = (double *)
                       ((double)(&local_540.m_dst)[lVar64] -
                       (double)local_5a0.m_dst[lVar64].
                               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                               .m_d.data);
                lVar64 = lVar64 + 1;
              } while (lVar64 != 6);
              local_680.m_dst[2].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_functor;
              local_680.m_dst[3].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_dstExpr;
              local_680.m_dst[4].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = pdStack_520;
              local_680.m_dst[5].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = pdStack_518;
              ((local_680.m_dst)->
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>).m_d.
              data = (double *)local_540.m_dst;
              local_680.m_dst[1].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_src;
              local_680.m_dst[2].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_functor;
              local_680.m_dst[3].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_dstExpr;
              lVar64 = 0;
              do {
                local_680.m_dst[lVar64].
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
                data = (double *)
                       ((double)local_680.m_dst[lVar64].
                                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                .m_d.data -
                       (double)local_5a0.m_dst[lVar64].
                               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                               .m_d.data);
                lVar64 = lVar64 + 1;
              } while (lVar64 != 6);
              lVar64 = 0;
              do {
                local_680.m_dst[lVar64].
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
                data = (double *)((double)(&local_540.m_dst)[lVar64] * 10.0);
                lVar64 = lVar64 + 1;
              } while (lVar64 != 6);
              lVar64 = 0;
              do {
                local_680.m_dst[lVar64].
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
                data = (double *)((double)(&local_540.m_dst)[lVar64] * 10.0);
                lVar64 = lVar64 + 1;
              } while (lVar64 != 6);
              poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                                          &local_680);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
              std::ostream::put((char)poVar65);
              std::ostream::flush();
              if ((local_680.m_src != (SrcEvaluatorType *)0x2) ||
                 (local_680.m_functor != (assign_op<double,_double> *)0x3)) {
                Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                          ((DenseStorage<double,__1,__1,__1,_1> *)&local_680,6,2,3);
              }
              if ((local_680.m_src != (SrcEvaluatorType *)0x2) ||
                 (local_680.m_functor != (assign_op<double,_double> *)0x3)) {
LAB_00107b23:
                pcVar71 = 
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, 2, 3, 1>, T1 = double, T2 = double]"
                ;
LAB_00107ce0:
                __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                              "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar71);
              }
              local_680.m_dst[2].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_functor;
              local_680.m_dst[3].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_dstExpr;
              local_680.m_dst[4].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = pdStack_520;
              local_680.m_dst[5].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = pdStack_518;
              ((local_680.m_dst)->
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>).m_d.
              data = (double *)local_540.m_dst;
              local_680.m_dst[1].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_src;
              local_680.m_dst[2].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_functor;
              local_680.m_dst[3].
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
              data = (double *)local_540.m_dstExpr;
              lVar64 = 0;
              do {
                local_680.m_dst[lVar64].
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
                data = (double *)
                       ((double)local_680.m_dst[lVar64].
                                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                .m_d.data * 10.0);
                lVar64 = lVar64 + 1;
              } while (lVar64 != 6);
              poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                                          &local_680);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
              std::ostream::put((char)poVar65);
              std::ostream::flush();
              gVar78 = local_220;
              local_220._0_16_ = ZEXT816(0);
              local_220.m_dstExpr = gVar78.m_dstExpr;
              local_220.m_functor = (assign_op<double,_double> *)0x0;
              Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                        ((DenseStorage<double,__1,__1,__1,_1> *)&local_220,6,3,2);
              gVar78 = local_160;
              local_160._0_16_ = ZEXT816(0);
              local_160.m_dstExpr = gVar78.m_dstExpr;
              local_160.m_functor = (assign_op<double,_double> *)0x0;
              Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                        ((DenseStorage<double,__1,__1,__1,_1> *)&local_160,6,2,3);
              if ((SrcEvaluatorType *)local_220.m_functor != local_160.m_src) {
                pcVar71 = 
                "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
                ;
LAB_00107d47:
                __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                              ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar71);
              }
              local_440._0_8_ = &local_220;
              local_440._8_8_ = &local_160;
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
              PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)local_100,
                         (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
                          *)local_440);
              if (local_160.m_src != (SrcEvaluatorType *)local_220.m_functor) {
                pcVar71 = 
                "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Option = 0]"
                ;
                goto LAB_00107d47;
              }
              local_440._0_8_ = &local_160;
              local_440._8_8_ = &local_220;
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
              PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,0>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_308,
                         (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_0>_>
                          *)local_440);
              chrono::Q_from_AngX(1.0471975511965976);
              chrono::ChMatrix33<double>::ChMatrix33
                        ((ChMatrix33<double> *)local_440,(ChQuaternion<double> *)local_600);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"rot * matrix\n",0xd);
              if (local_220.m_src != (SrcEvaluatorType *)0x3) {
                pcVar71 = 
                "Eigen::Product<Eigen::Matrix<double, 3, 3, 1>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 3, 3, 1>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
                ;
                goto LAB_00107d47;
              }
              local_600._8_8_ = &local_220;
              local_600._0_8_ = (ChMatrix33<double> *)local_440;
              poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
                                           *)local_600);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
              std::ostream::put((char)poVar65);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"matrix * rot\n",0xd);
              if (local_160.m_functor != (assign_op<double,_double> *)0x3) {
                pcVar71 = 
                "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 3, 3, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 3, 3, 1>, Option = 0]"
                ;
                goto LAB_00107d47;
              }
              local_600._8_8_ = (ChMatrix33<double> *)local_440;
              local_600._0_8_ = &local_160;
              poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                                           *)local_600);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
              std::ostream::put((char)poVar65);
              std::ostream::flush();
              if (local_308 != 0.0) {
                free(*(void **)((long)local_308 + -8));
              }
              if ((Scalar)local_100._0_8_ != 0.0) {
                free(*(void **)(local_100._0_8_ + -8));
              }
              if (local_160.m_dst != (DstEvaluatorType *)0x0) {
                free(local_160.m_dst[-1].
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                     .m_d.data);
              }
              if (local_220.m_dst != (DstEvaluatorType *)0x0) {
                free(local_220.m_dst[-1].
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                     .m_d.data);
              }
              if (local_680.m_dst != (DstEvaluatorType *)0x0) {
                free(local_680.m_dst[-1].
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                     .m_d.data);
              }
              if (local_5a0.m_dst != (DstEvaluatorType *)0x0) {
                free(local_5a0.m_dst[-1].
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                     .m_d.data);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"\n=== Chrono extensions to Eigen::MatrixBase ===\n",
                         0x30);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
              iVar59 = rand();
              local_540.m_dst =
                   (DstEvaluatorType *)(((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0);
              iVar59 = rand();
              local_540.m_src =
                   (SrcEvaluatorType *)(((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0);
              iVar59 = rand();
              local_540.m_functor =
                   (assign_op<double,_double> *)
                   (((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0);
              iVar59 = rand();
              local_540.m_dstExpr =
                   (DstXprType *)(((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0);
              iVar59 = rand();
              pdStack_520 = (double *)(((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0);
              iVar59 = rand();
              pdStack_518 = (double *)(((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"random 2x3 matrix A:\n",0x15);
              poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)
                                          &local_540);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
              std::ostream::put((char)poVar65);
              std::ostream::flush();
              local_540.m_dst = (DstEvaluatorType *)0x4024333333333333;
              pdStack_520 = (double *)0x4024333333333333;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"fill diagonal with 10.1:\n",0x19);
              poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)
                                          &local_540);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
              std::ostream::put((char)poVar65);
              std::ostream::flush();
              lVar64 = 0;
              do {
                *(undefined8 *)((long)&local_540.m_dst + lVar64) = 0x4000cccccccccccd;
                lVar64 = lVar64 + 8;
              } while (lVar64 != 0x30);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"fill entire matrix with 2.1:\n",0x1d);
              poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)
                                          &local_540);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
              std::ostream::put((char)poVar65);
              std::ostream::flush();
              auVar81 = _local_600;
              auStack_5f0._0_8_ = local_540.m_functor;
              auStack_5f0._8_8_ = local_540.m_dstExpr;
              auStack_5e0._0_8_ = pdStack_520;
              _dStack_5d0 = auVar81._48_16_;
              auVar74 = _dStack_5d0;
              auStack_5e0._8_8_ = pdStack_518;
              auVar81 = _local_600;
              local_600._8_8_ = local_540.m_src;
              local_600._0_8_ = local_540.m_dst;
              _auStack_5e0 = auVar81._32_32_;
              auStack_5e0._8_8_ = (double)pdStack_518 + 0.01;
              _local_600 = CONCAT1648(auVar74,_local_600);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"matrix B = A with B(1,2) incremented by 0.01\n",0x2d
                        );
              poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)
                                          local_600);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
              std::ostream::put((char)poVar65);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"|A-B| < 0.1?   ",0xf);
              auVar74._8_8_ = local_540.m_src;
              auVar74._0_8_ = local_540.m_dst;
              auVar75._8_8_ = local_540.m_dstExpr;
              auVar75._0_8_ = local_540.m_functor;
              auVar57._8_8_ = pdStack_518;
              auVar57._0_8_ = pdStack_520;
              auVar74 = vsubpd_avx(auVar74,local_600);
              auVar134._8_8_ = 0x7fffffffffffffff;
              auVar134._0_8_ = 0x7fffffffffffffff;
              auVar74 = vandpd_avx(auVar74,auVar134);
              auVar32 = vsubpd_avx(auVar75,auStack_5f0);
              auVar32 = vandpd_avx(auVar32,auVar134);
              auVar75 = vsubpd_avx(auVar57,auStack_5e0);
              auVar75 = vandpd_avx(auVar75,auVar134);
              auVar32 = vmaxpd_avx(auVar75,auVar32);
              auVar74 = vmaxpd_avx(auVar32,auVar74);
              auVar32 = vshufpd_avx(auVar74,auVar74,1);
              vmaxsd_avx(auVar32,auVar74);
              poVar65 = std::ostream::_M_insert<bool>(true);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
              std::ostream::put((char)poVar65);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"|A-B| < 0.001? ",0xf);
              auVar32._8_8_ = local_540.m_src;
              auVar32._0_8_ = local_540.m_dst;
              auVar76._8_8_ = local_540.m_dstExpr;
              auVar76._0_8_ = local_540.m_functor;
              auVar58._8_8_ = pdStack_518;
              auVar58._0_8_ = pdStack_520;
              auVar74 = vsubpd_avx(auVar32,local_600);
              auVar135._8_8_ = 0x7fffffffffffffff;
              auVar135._0_8_ = 0x7fffffffffffffff;
              auVar74 = vandpd_avx(auVar74,auVar135);
              auVar32 = vsubpd_avx(auVar76,auStack_5f0);
              auVar32 = vandpd_avx(auVar32,auVar135);
              auVar75 = vsubpd_avx(auVar58,auStack_5e0);
              auVar75 = vandpd_avx(auVar75,auVar135);
              auVar32 = vmaxpd_avx(auVar75,auVar32);
              auVar74 = vmaxpd_avx(auVar32,auVar74);
              auVar32 = vshufpd_avx(auVar74,auVar74,1);
              vmaxsd_avx(auVar32,auVar74);
              poVar65 = std::ostream::_M_insert<bool>(true);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
              std::ostream::put((char)poVar65);
              std::ostream::flush();
              local_5a0.m_dst = (DstEvaluatorType *)0x0;
              local_5a0.m_src = (SrcEvaluatorType *)0x0;
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_5a0,3);
              local_440._8_8_ = 0.0;
              local_440._16_8_ =
                   (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                    *)0x1;
              local_440._24_8_ = 4.94065645841247e-324;
              local_440._0_8_ = &local_5a0;
              if ((long)local_5a0.m_src < 1) {
LAB_00107bbf:
                local_440._24_8_ = 4.94065645841247e-324;
                local_440._16_8_ = 4.94065645841247e-324;
                local_440._8_8_ = 0;
                __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                              ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                              "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                             );
              }
              ((local_5a0.m_dst)->
              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>).m_d.
              data = (double *)0x4000000000000000;
              local_680.m_dst = (DstEvaluatorType *)0x4008000000000000;
              pCVar66 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                                  ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                   local_440,(Scalar *)&local_680);
              local_220.m_dst = (DstEvaluatorType *)0x4010000000000000;
              Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (pCVar66,(Scalar *)&local_220);
              if ((local_440._24_8_ + local_440._8_8_ == *(long *)(local_440._0_8_ + 8)) &&
                 ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                   *)local_440._16_8_ ==
                  (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                   *)0x1)) {
                local_680._0_16_ = ZEXT816(0);
                Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                          ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_680,3)
                ;
                local_440._8_8_ = 0.0;
                local_440._16_8_ =
                     (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                      *)0x1;
                local_440._24_8_ = 4.94065645841247e-324;
                local_440._0_8_ = &local_680;
                if ((long)local_680.m_src < 1) goto LAB_00107bbf;
                ((local_680.m_dst)->
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>).m_d
                .data = (double *)0x3fb999999999999a;
                local_220.m_dst = (DstEvaluatorType *)0x3fc999999999999a;
                local_440._0_8_ = &local_680;
                pCVar66 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
                          operator_((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                    local_440,(Scalar *)&local_220);
                local_160.m_dst = (DstEvaluatorType *)0x3fd3333333333333;
                Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                          (pCVar66,(Scalar *)&local_160);
                if ((local_440._24_8_ + local_440._8_8_ == *(long *)(local_440._0_8_ + 8)) &&
                   ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)local_440._16_8_ ==
                    (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)0x1)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"||v||_wrms, w = ",0x10);
                  SVar83 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                           wrmsNorm<Eigen::Matrix<double,_1,1,0,_1,1>>
                                     ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_5a0,
                                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &local_680,(type *)0x0);
                  poVar65 = std::ostream::_M_insert<double>(SVar83);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
                  std::ostream::put((char)poVar65);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"||v + v||_wrms, w = ",0x14);
                  local_440._0_8_ = &local_5a0;
                  local_440._8_8_ = &local_5a0;
                  SVar84 = Eigen::
                           MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
                           ::wrmsNorm<Eigen::Matrix<double,_1,1,0,_1,1>>
                                     ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                       *)local_440,
                                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &local_680,(type *)0x0);
                  poVar65 = std::ostream::_M_insert<double>(SVar84);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65);
                  std::ostream::put((char)poVar65);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"v + v + 1: ",0xb);
                  if (-1 < (long)local_5a0.m_src) {
                    local_440._32_8_ = local_5a0.m_src;
                    local_440._48_8_ = 1.0;
                    local_440._8_8_ = &local_5a0;
                    local_440._16_8_ = &local_5a0;
                    poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                                 *)local_440);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) + (char)poVar65)
                    ;
                    std::ostream::put((char)poVar65);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"1 + v: ",7);
                    if (-1 < (long)local_5a0.m_src) {
                      local_440._8_8_ = local_5a0.m_src;
                      local_440._24_8_ = 1.0;
                      local_440._32_8_ = &local_5a0;
                      poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                  (
                                                  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                                  *)local_440);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                      (char)poVar65);
                      std::ostream::put((char)poVar65);
                      std::ostream::flush();
                      if (local_680.m_dst != (DstEvaluatorType *)0x0) {
                        free(local_680.m_dst[-1].
                             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                             .m_d.data);
                      }
                      if (local_5a0.m_dst != (DstEvaluatorType *)0x0) {
                        free(local_5a0.m_dst[-1].
                             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                             .m_d.data);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\n=== Matrix comparison tests ===\n",0x21);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                      std::ostream::put(-0x78);
                      std::ostream::flush();
                      iVar59 = rand();
                      iVar60 = rand();
                      iVar61 = rand();
                      iVar62 = rand();
                      iVar63 = rand();
                      local_480._0_4_ = rand();
                      local_440._0_8_ =
                           (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                            *)0x0;
                      local_440._8_8_ =
                           (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                            *)0x0;
                      local_440._16_8_ =
                           (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                            *)0x0;
                      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                                ((DenseStorage<double,__1,__1,__1,_1> *)local_440,6,2,3);
                      if (((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                            *)local_440._8_8_ ==
                           (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                            *)0x2) &&
                         ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                           *)local_440._16_8_ ==
                          (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                           *)0x3)) {
                        dVar26 = ((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0;
                        dVar27 = ((double)iVar60 + (double)iVar60) / 2147483647.0 + -1.0;
                        auVar115._8_8_ = 0;
                        auVar115._0_8_ = dVar27;
                        auVar127._8_8_ = 0;
                        auVar127._0_8_ = dVar26;
                        auVar74 = vunpcklpd_avx(auVar127,auVar115);
                        local_1c0 = ZEXT1664(auVar74);
                        dVar28 = ((double)iVar61 + (double)iVar61) / 2147483647.0 + -1.0;
                        auVar85._8_8_ = 0;
                        auVar85._0_8_ = dVar28;
                        auVar81 = vbroadcastsd_avx512f(auVar85);
                        gVar78.m_functor = auVar81._16_8_;
                        dVar29 = ((double)iVar62 + (double)iVar62) / 2147483647.0 + -1.0;
                        auVar160._8_8_ = 0;
                        auVar160._0_8_ = dVar29;
                        auVar81 = vbroadcastsd_avx512f(auVar160);
                        auVar77 = CONCAT816(gVar78.m_functor,auVar74);
                        gVar78.m_dstExpr = auVar81._24_8_;
                        auVar80 = CONCAT824(gVar78.m_dstExpr,auVar77);
                        local_2c0 = ZEXT3264(auVar80);
                        dVar30 = ((double)iVar63 + (double)iVar63) / 2147483647.0 + -1.0;
                        auVar149._8_8_ = 0;
                        auVar149._0_8_ = dVar30;
                        auVar81 = vbroadcastsd_avx512f(auVar149);
                        dVar31 = ((double)(int)local_480._0_4_ + (double)(int)local_480._0_4_) /
                                 2147483647.0 + -1.0;
                        auVar136._8_8_ = 0;
                        auVar136._0_8_ = dVar31;
                        auVar82 = vbroadcastsd_avx512f(auVar136);
                        gVar78.m_dst = (DstEvaluatorType *)auVar74._0_8_;
                        gVar78.m_src = (SrcEvaluatorType *)auVar74._8_8_;
                        local_480 = ZEXT4864(CONCAT840(auVar82._40_8_,
                                                       CONCAT832(auVar81._32_8_,gVar78)));
                        auVar74 = vextractf32x4_avx512f(local_480,2);
                        *(undefined1 (*) [16])(local_440._0_8_ + 0x10) = auVar74;
                        *(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                          *)local_440._0_8_ = gVar78;
                        if ((dVar26 == *(double *)local_440._0_8_) &&
                           (!NAN(dVar26) && !NAN(*(double *)local_440._0_8_))) {
                          pdVar70 = ((DenseStorage<double,__1,__1,__1,_1> *)(local_440._0_8_ + 0x18)
                                    )->m_data;
                          if ((dVar29 == (double)pdVar70) && (!NAN(dVar29) && !NAN((double)pdVar70))
                             ) {
                            if ((dVar27 == (double)*(SrcEvaluatorType **)(local_440._0_8_ + 8)) &&
                               (!NAN(dVar27) &&
                                !NAN((double)*(SrcEvaluatorType **)(local_440._0_8_ + 8)))) {
                              pDVar1 = ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                         *)(local_440._0_8_ + 0x20))->m_dst;
                              if ((dVar30 == (double)pDVar1) &&
                                 (!NAN(dVar30) && !NAN((double)pDVar1))) {
                                if ((dVar28 == (double)*(assign_op<double,_double> **)
                                                        (local_440._0_8_ + 0x10)) &&
                                   (!NAN(dVar28) &&
                                    !NAN((double)*(assign_op<double,_double> **)
                                                  (local_440._0_8_ + 0x10)))) {
                                  if ((dVar31 == (double)*(SrcEvaluatorType **)
                                                          (local_440._0_8_ + 0x28)) &&
                                     (!NAN(dVar31) &&
                                      !NAN((double)*(SrcEvaluatorType **)(local_440._0_8_ + 0x28))))
                                  {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,"Matrices are exactly equal",
                                               0x1a);
                                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78
                                                   );
                                    std::ostream::put(-0x78);
                                    std::ostream::flush();
                                  }
                                }
                              }
                            }
                          }
                        }
                        if (((long)local_440._8_8_ < 2) || ((long)local_440._16_8_ < 3))
                        goto LAB_00107b01;
                        ((assign_op<double,_double> **)(local_440._0_8_ + 0x10))[local_440._16_8_] =
                             (assign_op<double,_double> *)
                             ((double)((assign_op<double,_double> **)(local_440._0_8_ + 0x10))
                                      [local_440._16_8_] + 0.001);
                        if (((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                              *)local_440._8_8_ !=
                             (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                              *)0x2) ||
                           ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                             *)local_440._16_8_ !=
                            (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                             *)0x3)) {
                          pcVar71 = 
                          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 2, 3, 1>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, 2, 3, 1>, Rhs = const Eigen::Matrix<double, -1, -1, 1>]"
                          ;
                          goto LAB_00107d66;
                        }
                        auVar74 = vsubpd_avx(local_1c0._0_16_,*(undefined1 (*) [16])local_440._0_8_)
                        ;
                        auVar137._8_8_ = 0x7fffffffffffffff;
                        auVar137._0_8_ = 0x7fffffffffffffff;
                        auVar74 = vandpd_avx(auVar74,auVar137);
                        auVar32 = vsubpd_avx(local_2c0._16_16_,
                                             *(undefined1 (*) [16])(local_440._0_8_ + 0x10));
                        auVar32 = vandpd_avx(auVar32,auVar137);
                        auVar75 = vextractf32x4_avx512f(local_480,2);
                        auVar3._0_8_ = ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                         *)(local_440._0_8_ + 0x20))->m_dst;
                        auVar3._8_8_ = ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                         *)(local_440._0_8_ + 0x20))->m_src;
                        auVar75 = vsubpd_avx(auVar75,auVar3);
                        auVar75 = vandpd_avx(auVar75,auVar137);
                        auVar32 = vmaxpd_avx(auVar75,auVar32);
                        auVar74 = vmaxpd_avx(auVar32,auVar74);
                        auVar32 = vshufpd_avx(auVar74,auVar74,1);
                        auVar74 = vmaxsd_avx(auVar32,auVar74);
                        if (auVar74._0_8_ <= 0.002) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"Matrices are equal within tol 0.002 \n",
                                     0x25);
                        }
                        if ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                             *)local_440._0_8_ !=
                            (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                             *)0x0) {
                          free(*(DstXprType **)(local_440._0_8_ + -8));
                        }
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "\n=== Pasting matrices and matrix-blocks ===\n",0x2c);
                        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                        std::ostream::put(-0x78);
                        std::ostream::flush();
                        gVar78 = local_680;
                        local_680._0_16_ = ZEXT816(0);
                        local_680.m_dstExpr = gVar78.m_dstExpr;
                        local_680.m_functor = (assign_op<double,_double> *)0x0;
                        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                                  ((DenseStorage<double,__1,__1,__1,_1> *)&local_680,0x18,4,6);
                        local_440._0_8_ = local_680.m_src;
                        local_440._8_8_ = local_680.m_functor;
                        if (-1 < (long)((ulong)local_680.m_functor | (ulong)local_680.m_src)) {
                          Eigen::internal::
                          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
                                    ((Matrix<double,__1,__1,_1,__1,__1> *)&local_680,
                                     (CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                      *)local_440,(assign_op<double,_double> *)&local_540);
                          poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                      (
                                                  DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  *)&local_680);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar65,"\n\n",2);
                          local_440._8_8_ = 0.0;
                          local_440._16_8_ =
                               (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                *)0x1;
                          local_440._24_8_ = 4.94065645841247e-324;
                          local_540.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
                          local_600._0_8_ = 0x4000000000000000;
                          local_440._0_8_ = &local_540;
                          pCVar67 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::
                                    operator_((CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>
                                               *)local_440,(Scalar *)local_600);
                          local_5a0.m_dst = (DstEvaluatorType *)0x4008000000000000;
                          pCVar67 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::
                                    operator_(pCVar67,(Scalar *)&local_5a0);
                          local_220.m_dst = (DstEvaluatorType *)0x4010000000000000;
                          pCVar67 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::
                                    operator_(pCVar67,(Scalar *)&local_220);
                          local_160.m_dst = (DstEvaluatorType *)0x4014000000000000;
                          pCVar67 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::
                                    operator_(pCVar67,(Scalar *)&local_160);
                          local_100._0_8_ = 0x4018000000000000;
                          Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                                    (pCVar67,(Scalar *)local_100);
                          if ((local_440._24_8_ + local_440._8_8_ == 2) &&
                             ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                               *)local_440._16_8_ ==
                              (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                               *)0x3)) {
                            poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                        (
                                                  DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *
                                                  )&local_540);
                            std::__ostream_insert<char,std::char_traits<char>>(poVar65,"\n\n",2);
                            auVar81 = _local_600;
                            uStack_340 = 0;
                            uStack_338 = 0;
                            uStack_330 = 0;
                            dStack_380 = 0.0;
                            dStack_378 = 0.0;
                            local_370 = 0;
                            local_368 = 0.0;
                            RStack_360 = 0.0;
                            IStack_358 = 0;
                            IStack_350 = 0;
                            uStack_348 = 0;
                            local_3c0 = 0;
                            dStack_3b8 = 0.0;
                            dStack_3b0 = 0.0;
                            dStack_3a8 = 0.0;
                            dStack_3a0 = 0.0;
                            dStack_398 = 0.0;
                            dStack_390 = 0.0;
                            dStack_388 = 0.0;
                            local_440._72_8_ = 0.0;
                            local_440._80_8_ = 0.0;
                            local_440._88_8_ = 0.0;
                            local_440._96_8_ = 0;
                            dStack_3d8 = 0.0;
                            uStack_3d0 = 0;
                            uStack_3c8 = 0;
                            local_440._0_8_ =
                                 (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                  *)0x0;
                            local_440._8_8_ = 0.0;
                            local_440._16_8_ =
                                 (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                  *)0x0;
                            local_440._24_8_ = 0.0;
                            local_440._32_8_ =
                                 (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                  *)0x0;
                            local_440._40_8_ = 0.0;
                            local_440._48_8_ = 0.0;
                            local_440._56_8_ = 0.0;
                            local_600._0_8_ = local_440 + 0x40;
                            auStack_5f0._0_8_ =
                                 (CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)
                                 local_440;
                            auStack_5f0._8_8_ = (DstXprType *)0x1;
                            auStack_5e0._0_8_ = 1;
                            _dStack_5d0 = auVar81._48_16_;
                            auStack_5e0._8_8_ = 7;
                            local_5a0.m_src = (SrcEvaluatorType *)0x0;
                            local_5a0.m_functor = (assign_op<double,_double> *)0x1;
                            local_5a0.m_dstExpr = (DstXprType *)0x1;
                            local_440._64_8_ = 10.0;
                            local_220.m_dst = (DstEvaluatorType *)0x4034000000000000;
                            local_5a0.m_dst = (DstEvaluatorType *)local_600;
                            pCVar68 = Eigen::
                                      CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>
                                      ::operator_((
                                                  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>
                                                  *)&local_5a0,(Scalar *)&local_220);
                            local_160.m_dst = (DstEvaluatorType *)0x403e000000000000;
                            pCVar68 = Eigen::
                                      CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>
                                      ::operator_(pCVar68,(Scalar *)&local_160);
                            local_100._0_8_ = 0x4044000000000000;
                            pCVar68 = Eigen::
                                      CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>
                                      ::operator_(pCVar68,(Scalar *)local_100);
                            local_308 = 50.0;
                            pCVar68 = Eigen::
                                      CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>
                                      ::operator_(pCVar68,&local_308);
                            local_90[0].m_data[0] = 60.0;
                            Eigen::
                            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>
                            ::operator_(pCVar68,local_90[0].m_data);
                            if (((long)&(local_5a0.m_src)->field_0x0 + (long)local_5a0.m_dstExpr ==
                                 2) && ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                         *)local_5a0.m_functor ==
                                        (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                         *)0x3)) {
                              poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                          (
                                                  DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *
                                                  )local_440);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar65,"\n\n",2);
                              Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::DenseStorage
                                        ((DenseStorage<double,__1,__1,__1,_1> *)local_600,
                                         (DenseStorage<double,__1,__1,__1,_1> *)&local_680);
                              if ((2 < (long)local_600._8_8_) && (4 < (long)auStack_5f0._0_8_)) {
                                pdVar70 = (double *)
                                          (local_600._0_8_ + (long)(auStack_5f0._0_8_ + 4) * 8);
                                lVar64 = 0x10;
                                do {
                                  dVar26 = *(double *)((long)&uStack_548 + lVar64);
                                  pdVar70[-2] = *(double *)((long)&uStack_550 + lVar64);
                                  pdVar70[-1] = dVar26;
                                  *pdVar70 = *(double *)((long)&local_540.m_dst + lVar64);
                                  lVar64 = lVar64 + 0x18;
                                  pdVar70 = pdVar70 + auStack_5f0._0_8_;
                                } while (lVar64 == 0x28);
                                poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                            (
                                                  DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  *)local_600);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar65,"\n\n",2)
                                ;
                                if ((2 < (long)local_600._8_8_) && (4 < (long)auStack_5f0._0_8_)) {
                                  pdVar70 = (double *)
                                            (local_600._0_8_ + (long)(auStack_5f0._0_8_ + 4) * 8);
                                  lVar64 = 0x40;
                                  do {
                                    dVar26 = *(double *)(local_440 + lVar64 + 8);
                                    pdVar70[-2] = *(double *)(local_440 + lVar64) + pdVar70[-2];
                                    pdVar70[-1] = dVar26 + pdVar70[-1];
                                    *pdVar70 = *(double *)(local_440 + lVar64 + 0x10) + *pdVar70;
                                    lVar64 = lVar64 + 0x38;
                                    pdVar70 = pdVar70 + auStack_5f0._0_8_;
                                  } while (lVar64 == 0x78);
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  *)local_600);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar65,"\n\n",2);
                                  if ((plainobjectbase_evaluator_data<double,_3>)local_600._0_8_ !=
                                      (plainobjectbase_evaluator_data<double,_3>)0x0) {
                                    free(*(void **)(local_600._0_8_ + -8));
                                  }
                                  if (local_680.m_dst != (DstEvaluatorType *)0x0) {
                                    free(local_680.m_dst[-1].
                                         super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                         .m_d.data);
                                  }
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "\n=== 3x3 matrix times vector ===\n",0x21);
                                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                                  std::ostream::put(-0x78);
                                  std::ostream::flush();
                                  local_600._0_8_ =
                                       (DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)local_440
                                  ;
                                  local_540.m_dst = (DstEvaluatorType *)local_600;
                                  local_540.m_src = (SrcEvaluatorType *)&local_5a0;
                                  local_540.m_functor = (assign_op<double,_double> *)&local_680;
                                  local_540.m_dstExpr = (DstXprType *)local_440;
                                  Eigen::internal::
                                  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
                                  ::run(&local_540);
                                  local_540.m_src = (SrcEvaluatorType *)0x0;
                                  local_540.m_functor = (assign_op<double,_double> *)0x0;
                                  local_540.m_dstExpr = (DstXprType *)0x0;
                                  pdStack_518 = (double *)0x0;
                                  uStack_510 = 0;
                                  uStack_50c = 0;
                                  uStack_508 = 0;
                                  uStack_504 = 0;
                                  local_540.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
                                  pdStack_520 = (double *)0x3ff0000000000000;
                                  local_500 = 1.0;
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *
                                                  )&local_540);
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  auVar128._8_8_ = 0;
                                  auVar128._0_8_ = local_440._16_8_;
                                  auVar75 = ZEXT816(0x4008000000000000);
                                  auVar150._8_8_ = 0;
                                  auVar150._0_8_ =
                                       (double)local_440._0_8_ +
                                       (double)local_440._8_8_ + (double)local_440._8_8_;
                                  auVar74 = vfmadd231sd_fma(auVar150,auVar128,auVar75);
                                  local_618 = auVar74._0_8_;
                                  auVar161._8_8_ = 0;
                                  auVar161._0_8_ = local_440._40_8_;
                                  auVar163._8_8_ = 0;
                                  auVar163._0_8_ =
                                       (double)local_440._24_8_ +
                                       (double)local_440._32_8_ + (double)local_440._32_8_;
                                  auVar74 = vfmadd231sd_fma(auVar163,auVar161,auVar75);
                                  local_610 = auVar74._0_8_;
                                  auVar164._8_8_ = 0;
                                  auVar164._0_8_ = local_440._48_8_;
                                  auVar166._8_8_ = 0;
                                  auVar166._0_8_ = local_440._56_8_;
                                  auVar168._8_8_ = 0;
                                  auVar168._0_8_ = local_440._64_8_;
                                  auVar170._8_8_ = 0;
                                  auVar170._0_8_ =
                                       (double)local_440._56_8_ + (double)local_440._56_8_ +
                                       (double)local_440._48_8_;
                                  auVar74 = vfmadd231sd_fma(auVar170,auVar168,auVar75);
                                  local_608 = auVar74._0_8_;
                                  auVar86._8_8_ = 0;
                                  auVar86._0_8_ =
                                       (double)local_440._0_8_ +
                                       (double)local_440._24_8_ + (double)local_440._24_8_;
                                  auVar74 = vfmadd231sd_fma(auVar86,auVar75,auVar164);
                                  auVar87._8_8_ = 0;
                                  auVar87._0_8_ =
                                       (double)local_440._8_8_ +
                                       (double)local_440._32_8_ + (double)local_440._32_8_;
                                  auVar32 = vfmadd231sd_fma(auVar87,auVar75,auVar166);
                                  auVar88._8_8_ = 0;
                                  auVar88._0_8_ =
                                       (double)local_440._16_8_ +
                                       (double)local_440._40_8_ + (double)local_440._40_8_;
                                  auVar75 = vfmadd231sd_fma(auVar88,auVar168,auVar75);
                                  local_2c0._0_8_ = auVar74._0_8_;
                                  local_1c0._0_8_ = auVar32._0_8_;
                                  local_480._0_8_ = auVar75._0_8_;
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *
                                                  )local_440);
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  poVar65 = std::ostream::_M_insert<double>(local_618);
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  poVar65 = std::ostream::_M_insert<double>(local_610);
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  std::ostream::_M_insert<double>((double)local_608);
                                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                                  std::ostream::put(-0x78);
                                  std::ostream::flush();
                                  poVar65 = std::ostream::_M_insert<double>((double)local_2c0._0_8_)
                                  ;
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  poVar65 = std::ostream::_M_insert<double>((double)local_1c0._0_8_)
                                  ;
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  std::ostream::_M_insert<double>((double)local_480._0_8_);
                                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                                  std::ostream::put(-0x78);
                                  std::ostream::flush();
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "\n=== Custom 3x4, 4x3, and 4x4 matrices ===\n",0x2b);
                                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                                  std::ostream::put(-0x78);
                                  std::ostream::flush();
                                  _local_600 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
                                  _local_5c0 = local_600._0_32_;
                                  local_90[0].m_data[0] = 10.0;
                                  local_90[0].m_data[1] = 10.0;
                                  local_90[0].m_data[2] = 10.0;
                                  poVar65 = std::ostream::_M_insert<double>(10.0);
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  poVar65 = std::ostream::_M_insert<double>(local_90[0].m_data[1]);
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  std::ostream::_M_insert<double>(local_90[0].m_data[2]);
                                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                                  std::ostream::put(-0x78);
                                  std::ostream::flush();
                                  local_5a0.m_dst =
                                       (DstEvaluatorType *)
                                       ((double)local_600._0_8_ + (double)local_600._0_8_);
                                  local_5a0.m_src =
                                       (SrcEvaluatorType *)
                                       ((double)local_600._8_8_ + (double)local_600._8_8_);
                                  local_5a0.m_functor =
                                       (assign_op<double,_double> *)
                                       ((double)auStack_5f0._0_8_ + (double)auStack_5f0._0_8_);
                                  local_5a0.m_dstExpr =
                                       (DstXprType *)
                                       ((double)auStack_5f0._8_8_ + (double)auStack_5f0._8_8_);
                                  local_580 = (double)auStack_5e0._0_8_ + (double)auStack_5e0._0_8_;
                                  dStack_578 = (double)auStack_5e0._8_8_ + (double)auStack_5e0._8_8_
                                  ;
                                  dStack_570 = dStack_5d0 + dStack_5d0;
                                  dStack_568 = dStack_5c8 + dStack_5c8;
                                  local_560 = (double)local_5c0._0_8_ + (double)local_5c0._0_8_;
                                  dStack_558 = (double)local_5c0._8_8_ + (double)local_5c0._8_8_;
                                  uStack_550 = dStack_5b0 + dStack_5b0;
                                  uStack_548 = dStack_5a8 + dStack_5a8;
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *
                                                  )&local_5a0);
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  auVar116._8_8_ = 0;
                                  auVar116._0_8_ = local_90[0].m_data[0];
                                  auVar4._8_8_ = 0;
                                  auVar4._0_8_ = local_5a0.m_dst;
                                  auVar89._8_8_ = 0;
                                  auVar89._0_8_ = local_90[0].m_data[1] * local_580;
                                  auVar74 = vfmadd231sd_fma(auVar89,auVar116,auVar4);
                                  auVar138._8_8_ = 0;
                                  auVar138._0_8_ = local_90[0].m_data[2];
                                  auVar5._8_8_ = 0;
                                  auVar5._0_8_ = local_560;
                                  auVar74 = vfmadd231sd_fma(auVar74,auVar138,auVar5);
                                  auVar6._8_8_ = 0;
                                  auVar6._0_8_ = local_5a0.m_src;
                                  auVar151._8_8_ = 0;
                                  auVar151._0_8_ = local_90[0].m_data[1] * dStack_578;
                                  auVar32 = vfmadd231sd_fma(auVar151,auVar116,auVar6);
                                  auVar7._8_8_ = 0;
                                  auVar7._0_8_ = dStack_558;
                                  auVar32 = vfmadd231sd_fma(auVar32,auVar138,auVar7);
                                  local_2c0._0_8_ = auVar32._0_8_;
                                  auVar8._8_8_ = 0;
                                  auVar8._0_8_ = local_5a0.m_functor;
                                  auVar152._8_8_ = 0;
                                  auVar152._0_8_ = local_90[0].m_data[1] * dStack_570;
                                  auVar32 = vfmadd231sd_fma(auVar152,auVar116,auVar8);
                                  auVar9._8_8_ = 0;
                                  auVar9._0_8_ = uStack_550;
                                  auVar32 = vfmadd231sd_fma(auVar32,auVar138,auVar9);
                                  local_1c0._0_8_ = auVar32._0_8_;
                                  auVar10._8_8_ = 0;
                                  auVar10._0_8_ = local_5a0.m_dstExpr;
                                  auVar129._8_8_ = 0;
                                  auVar129._0_8_ = local_90[0].m_data[1] * dStack_568;
                                  auVar32 = vfmadd231sd_fma(auVar129,auVar116,auVar10);
                                  auVar11._8_8_ = 0;
                                  auVar11._0_8_ = uStack_548;
                                  auVar32 = vfmadd231sd_fma(auVar32,auVar138,auVar11);
                                  local_480._0_8_ = auVar32._0_8_;
                                  poVar65 = std::ostream::_M_insert<double>(auVar74._0_8_);
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  poVar65 = std::ostream::_M_insert<double>((double)local_2c0._0_8_)
                                  ;
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  poVar65 = std::ostream::_M_insert<double>((double)local_1c0._0_8_)
                                  ;
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  std::ostream::_M_insert<double>((double)local_480._0_8_);
                                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                                  std::ostream::put(-0x78);
                                  std::ostream::flush();
                                  local_540.m_dst = (DstEvaluatorType *)local_600;
                                  chrono::operator*((
                                                  Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *
                                                  )&local_540,local_90);
                                  local_608 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                               *)local_440._0_8_;
                                  local_2c0._0_8_ = local_440._8_8_;
                                  local_1c0._0_8_ = local_440._16_8_;
                                  local_480._0_8_ = local_440._24_8_;
                                  poVar65 = std::ostream::_M_insert<double>((double)local_440._0_8_)
                                  ;
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  poVar65 = std::ostream::_M_insert<double>((double)local_2c0._0_8_)
                                  ;
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  poVar65 = std::ostream::_M_insert<double>((double)local_1c0._0_8_)
                                  ;
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  std::ostream::_M_insert<double>((double)local_480._0_8_);
                                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                                  std::ostream::put(-0x78);
                                  std::ostream::flush();
                                  chrono::Q_from_AngX(0.5235987755982988);
                                  chrono::ChMatrix33<double>::ChMatrix33
                                            ((ChMatrix33<double> *)&local_308,
                                             (ChQuaternion<double> *)local_440);
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *
                                                  )&local_308);
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  local_440._0_8_ =
                                       (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
                                       &local_308;
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                                  *)local_440);
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  auVar79._8_8_ = local_308;
                                  auVar79._0_8_ = local_308;
                                  auVar79._16_8_ = local_308;
                                  auVar79._24_8_ = local_308;
                                  auVar148._8_8_ = local_300;
                                  auVar148._0_8_ = local_300;
                                  auVar148._16_8_ = local_300;
                                  auVar148._24_8_ = local_300;
                                  auVar79 = vmulpd_avx512vl((undefined1  [32])_local_600,auVar79);
                                  auVar159._8_8_ = local_2f8;
                                  auVar159._0_8_ = local_2f8;
                                  auVar159._16_8_ = local_2f8;
                                  auVar159._24_8_ = local_2f8;
                                  auVar74 = vfmadd231pd_fma(auVar79,_auStack_5e0,auVar148);
                                  auVar74 = vfmadd231pd_fma(ZEXT1632(auVar74),_local_5c0,auVar159);
                                  auVar167._8_8_ = local_2f0;
                                  auVar167._0_8_ = local_2f0;
                                  auVar167._16_8_ = local_2f0;
                                  auVar167._24_8_ = local_2f0;
                                  local_680 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                               )ZEXT1632(auVar74);
                                  auVar80 = vmulpd_avx512vl((undefined1  [32])_local_600,auVar167);
                                  auVar165._8_8_ = local_2e8;
                                  auVar165._0_8_ = local_2e8;
                                  auVar165._16_8_ = local_2e8;
                                  auVar165._24_8_ = local_2e8;
                                  auVar74 = vfmadd231pd_fma(auVar80,_auStack_5e0,auVar165);
                                  auVar162._8_8_ = local_2e0;
                                  auVar162._0_8_ = local_2e0;
                                  auVar162._16_8_ = local_2e0;
                                  auVar162._24_8_ = local_2e0;
                                  auVar74 = vfmadd231pd_fma(ZEXT1632(auVar74),_local_5c0,auVar162);
                                  local_660 = ZEXT1632(auVar74);
                                  auVar172._8_8_ = local_2d8;
                                  auVar172._0_8_ = local_2d8;
                                  auVar172._16_8_ = local_2d8;
                                  auVar172._24_8_ = local_2d8;
                                  auVar171._8_8_ = local_2d0;
                                  auVar171._0_8_ = local_2d0;
                                  auVar171._16_8_ = local_2d0;
                                  auVar171._24_8_ = local_2d0;
                                  auVar80 = vmulpd_avx512vl((undefined1  [32])_local_600,auVar172);
                                  auVar74 = vfmadd231pd_fma(auVar80,_auStack_5e0,auVar171);
                                  auVar169._8_8_ = local_2c8;
                                  auVar169._0_8_ = local_2c8;
                                  auVar169._16_8_ = local_2c8;
                                  auVar169._24_8_ = local_2c8;
                                  auVar74 = vfmadd231pd_fma(ZEXT1632(auVar74),_local_5c0,auVar169);
                                  local_640 = ZEXT1632(auVar74);
                                  auVar112._0_8_ = local_308 * (double)local_5a0.m_dst;
                                  auVar112._8_8_ = local_308 * (double)local_5a0.m_src;
                                  auVar112._16_8_ = local_308 * (double)local_5a0.m_functor;
                                  auVar112._24_8_ = local_308 * (double)local_5a0.m_dstExpr;
                                  auVar80._8_8_ = dStack_578;
                                  auVar80._0_8_ = local_580;
                                  auVar80._16_8_ = dStack_570;
                                  auVar80._24_8_ = dStack_568;
                                  auVar74 = vfmadd231pd_fma(auVar112,auVar80,auVar148);
                                  auVar56._8_8_ = dStack_558;
                                  auVar56._0_8_ = local_560;
                                  auVar56._16_8_ = uStack_550;
                                  auVar56._24_8_ = uStack_548;
                                  auVar74 = vfmadd231pd_fma(ZEXT1632(auVar74),auVar56,auVar159);
                                  local_220 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                               )ZEXT1632(auVar74);
                                  auVar173._0_8_ = local_2f0 * (double)local_5a0.m_dst;
                                  auVar173._8_8_ = local_2f0 * (double)local_5a0.m_src;
                                  auVar173._16_8_ = local_2f0 * (double)local_5a0.m_functor;
                                  auVar173._24_8_ = local_2f0 * (double)local_5a0.m_dstExpr;
                                  auVar74 = vfmadd231pd_fma(auVar173,auVar80,auVar165);
                                  auVar74 = vfmadd231pd_fma(ZEXT1632(auVar74),auVar56,auVar162);
                                  local_200 = ZEXT1632(auVar74);
                                  auVar174._0_8_ = local_2d8 * (double)local_5a0.m_dst;
                                  auVar174._8_8_ = local_2d8 * (double)local_5a0.m_src;
                                  auVar174._16_8_ = local_2d8 * (double)local_5a0.m_functor;
                                  auVar174._24_8_ = local_2d8 * (double)local_5a0.m_dstExpr;
                                  auVar74 = vfmadd231pd_fma(auVar174,auVar80,auVar171);
                                  auVar74 = vfmadd231pd_fma(ZEXT1632(auVar74),auVar56,auVar169);
                                  local_1e0 = ZEXT1632(auVar74);
                                  auVar74 = vfmadd231pd_fma(auVar112,auVar167,auVar80);
                                  auVar74 = vfmadd231pd_fma(ZEXT1632(auVar74),auVar172,auVar56);
                                  local_160 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                               )ZEXT1632(auVar74);
                                  auVar113._0_8_ = (double)local_5a0.m_dst * local_300;
                                  auVar113._8_8_ = (double)local_5a0.m_src * local_300;
                                  auVar113._16_8_ = (double)local_5a0.m_functor * local_300;
                                  auVar113._24_8_ = (double)local_5a0.m_dstExpr * local_300;
                                  auVar74 = vfmadd231pd_fma(auVar113,auVar165,auVar80);
                                  auVar74 = vfmadd231pd_fma(ZEXT1632(auVar74),auVar171,auVar56);
                                  local_140 = ZEXT1632(auVar74);
                                  auVar114._0_8_ = (double)local_5a0.m_dst * local_2f8;
                                  auVar114._8_8_ = (double)local_5a0.m_src * local_2f8;
                                  auVar114._16_8_ = (double)local_5a0.m_functor * local_2f8;
                                  auVar114._24_8_ = (double)local_5a0.m_dstExpr * local_2f8;
                                  auVar74 = vfmadd231pd_fma(auVar114,auVar162,auVar80);
                                  auVar74 = vfmadd231pd_fma(ZEXT1632(auVar74),auVar169,auVar56);
                                  local_120 = ZEXT1632(auVar74);
                                  auVar74 = vfmadd231pd_fma(auVar79,auVar167,_auStack_5e0);
                                  auVar74 = vfmadd231pd_fma(ZEXT1632(auVar74),auVar172,_local_5c0);
                                  _local_100 = ZEXT1632(auVar74);
                                  auVar80 = vmulpd_avx512vl((undefined1  [32])_local_600,auVar148);
                                  auVar74 = vfmadd231pd_fma(auVar80,auVar165,_auStack_5e0);
                                  auVar74 = vfmadd231pd_fma(ZEXT1632(auVar74),auVar171,_local_5c0);
                                  local_e0 = ZEXT1632(auVar74);
                                  auVar80 = vmulpd_avx512vl((undefined1  [32])_local_600,auVar159);
                                  auVar74 = vfmadd231pd_fma(auVar80,auVar162,_auStack_5e0);
                                  auVar74 = vfmadd231pd_fma(ZEXT1632(auVar74),auVar169,_local_5c0);
                                  local_c0 = ZEXT1632(auVar74);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"rot * G:\n",9);
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *
                                                  )&local_680);
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"rot * (G\').transpose:\n",0x16);
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *
                                                  )&local_220);
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"G\' * rot:\n",10);
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *
                                                  )&local_160);
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"G.transpose * rot:\n",0x13);
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *
                                                  )local_100);
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  local_540.m_dst = (DstEvaluatorType *)&local_228;
                                  local_540.m_src = &local_482;
                                  local_540.m_functor = &local_619;
                                  local_540.m_dstExpr = (DstXprType *)local_440;
                                  local_228.data = (double *)local_440;
                                  iVar59 = rand();
                                  local_440._0_8_ =
                                       ((double)iVar59 + (double)iVar59) / 2147483647.0 + -1.0;
                                  pdVar70 = *(double **)
                                             &(local_540.m_dst)->
                                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                  ;
                                  iVar59 = rand();
                                  pdVar70[1] = ((double)iVar59 + (double)iVar59) / 2147483647.0 +
                                               -1.0;
                                  pdVar70 = *(double **)
                                             &(local_540.m_dst)->
                                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                  ;
                                  iVar59 = rand();
                                  pdVar70[2] = ((double)iVar59 + (double)iVar59) / 2147483647.0 +
                                               -1.0;
                                  pdVar70 = *(double **)
                                             &(local_540.m_dst)->
                                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                  ;
                                  iVar59 = rand();
                                  pdVar70[3] = ((double)iVar59 + (double)iVar59) / 2147483647.0 +
                                               -1.0;
                                  pdVar70 = *(double **)
                                             &(local_540.m_dst)->
                                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                  ;
                                  iVar59 = rand();
                                  pdVar70[4] = ((double)iVar59 + (double)iVar59) / 2147483647.0 +
                                               -1.0;
                                  pdVar70 = *(double **)
                                             &(local_540.m_dst)->
                                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                  ;
                                  iVar59 = rand();
                                  pdVar70[5] = ((double)iVar59 + (double)iVar59) / 2147483647.0 +
                                               -1.0;
                                  pdVar70 = *(double **)
                                             &(local_540.m_dst)->
                                              super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                  ;
                                  iVar59 = rand();
                                  pdVar70[6] = ((double)iVar59 + (double)iVar59) / 2147483647.0 +
                                               -1.0;
                                  Eigen::internal::
                                  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_7,_16>
                                  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                         *)&local_540);
                                  auVar117._8_8_ = 0;
                                  auVar117._0_8_ = local_608;
                                  auVar12._8_8_ = 0;
                                  auVar12._0_8_ = local_440._0_8_;
                                  auVar153._8_8_ = 0;
                                  auVar153._0_8_ = (double)local_2c0._0_8_ * (double)local_440._8_8_
                                  ;
                                  auVar74 = vfmadd231sd_fma(auVar153,auVar117,auVar12);
                                  auVar130._8_8_ = 0;
                                  auVar130._0_8_ = local_1c0._0_8_;
                                  auVar13._8_8_ = 0;
                                  auVar13._0_8_ = local_440._16_8_;
                                  auVar74 = vfmadd231sd_fma(auVar74,auVar130,auVar13);
                                  auVar90._8_8_ = 0;
                                  auVar90._0_8_ = local_480._0_8_;
                                  auVar14._8_8_ = 0;
                                  auVar14._0_8_ = local_440._24_8_;
                                  auVar74 = vfmadd231sd_fma(auVar74,auVar90,auVar14);
                                  local_490 = auVar74._0_8_;
                                  auVar15._8_8_ = 0;
                                  auVar15._0_8_ = local_440._32_8_;
                                  auVar154._8_8_ = 0;
                                  auVar154._0_8_ =
                                       (double)local_2c0._0_8_ * (double)local_440._40_8_;
                                  auVar74 = vfmadd231sd_fma(auVar154,auVar117,auVar15);
                                  auVar16._8_8_ = 0;
                                  auVar16._0_8_ = local_440._48_8_;
                                  auVar74 = vfmadd231sd_fma(auVar74,auVar130,auVar16);
                                  auVar17._8_8_ = 0;
                                  auVar17._0_8_ = local_440._56_8_;
                                  auVar74 = vfmadd231sd_fma(auVar74,auVar90,auVar17);
                                  local_618 = auVar74._0_8_;
                                  auVar18._8_8_ = 0;
                                  auVar18._0_8_ = local_440._64_8_;
                                  auVar155._8_8_ = 0;
                                  auVar155._0_8_ =
                                       (double)local_2c0._0_8_ * (double)local_440._72_8_;
                                  auVar74 = vfmadd231sd_fma(auVar155,auVar117,auVar18);
                                  auVar19._8_8_ = 0;
                                  auVar19._0_8_ = local_440._80_8_;
                                  auVar74 = vfmadd231sd_fma(auVar74,auVar130,auVar19);
                                  auVar20._8_8_ = 0;
                                  auVar20._0_8_ = local_440._88_8_;
                                  auVar74 = vfmadd231sd_fma(auVar74,auVar90,auVar20);
                                  local_610 = auVar74._0_8_;
                                  auVar21._8_8_ = 0;
                                  auVar21._0_8_ = local_440._96_8_;
                                  auVar139._8_8_ = 0;
                                  auVar139._0_8_ = (double)local_2c0._0_8_ * dStack_3d8;
                                  auVar74 = vfmadd231sd_fma(auVar139,auVar117,auVar21);
                                  auVar22._8_8_ = 0;
                                  auVar22._0_8_ = uStack_3d0;
                                  auVar74 = vfmadd231sd_fma(auVar74,auVar130,auVar22);
                                  auVar23._8_8_ = 0;
                                  auVar23._0_8_ = uStack_3c8;
                                  auVar74 = vfmadd231sd_fma(auVar74,auVar90,auVar23);
                                  local_480._0_8_ = auVar74._0_8_;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"Random 4x4 * q:\n",0x10);
                                  poVar65 = std::ostream::_M_insert<double>(local_490);
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  poVar65 = std::ostream::_M_insert<double>(local_618);
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  poVar65 = std::ostream::_M_insert<double>(local_610);
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65,"  ",2)
                                  ;
                                  std::ostream::_M_insert<double>((double)local_480._0_8_);
                                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                                  std::ostream::put(-0x78);
                                  std::ostream::flush();
                                  local_540.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
                                  local_540.m_src = (SrcEvaluatorType *)0xc000000000000000;
                                  local_540.m_functor =
                                       (assign_op<double,_double> *)0xc008000000000000;
                                  local_540.m_dstExpr = (DstXprType *)0xc010000000000000;
                                  pdStack_520 = (double *)0x4000000000000000;
                                  pdStack_518 = (double *)0x3ff0000000000000;
                                  uStack_510 = 0;
                                  uStack_50c = 0xc0100000;
                                  uStack_508 = 0;
                                  uStack_504 = 0x40080000;
                                  local_500 = 3.0;
                                  local_4f8 = 0x4010000000000000;
                                  local_4f0 = 0x3ff0000000000000;
                                  local_4e8 = 0xc000000000000000;
                                  local_4e0 = 0x4010000000000000;
                                  local_4d8 = 0xc008000000000000;
                                  uStack_4d0 = 0x4000000000000000;
                                  local_4c8 = 0x3ff0000000000000;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"4x4 star matrix X:\n",0x13);
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *
                                                  )&local_540);
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  uStack_50c = uStack_50c ^ 0x80000000;
                                  uStack_504 = uStack_504 ^ 0x80000000;
                                  auVar118._0_8_ = local_4f8 ^ 0x8000000000000000;
                                  auVar118._8_4_ = 0;
                                  auVar118._12_4_ = 0x80000000;
                                  local_4f8 = vmovlps_avx(auVar118);
                                  auVar119._0_8_ = local_4e8 ^ 0x8000000000000000;
                                  auVar119._8_4_ = 0;
                                  auVar119._12_4_ = 0x80000000;
                                  local_4e8 = vmovlps_avx(auVar119);
                                  local_4d8 = local_4d8 ^ 0x8000000000000000;
                                  uStack_4d0 = uStack_4d0 ^ 0x8000000000000000;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"Semi-transpose X:\n",0x12);
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *
                                                  )&local_540);
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  lVar64 = 0x18;
                                  do {
                                    uVar54 = *(undefined4 *)((long)&uStack_548 + lVar64);
                                    uVar55 = *(uint *)((long)&uStack_548 + lVar64 + 4);
                                    *(undefined4 *)((long)&uStack_550 + lVar64) =
                                         *(undefined4 *)((long)&uStack_550 + lVar64);
                                    *(uint *)((long)&uStack_550 + lVar64 + 4) =
                                         *(uint *)((long)&uStack_550 + lVar64 + 4) ^ 0x80000000;
                                    *(undefined4 *)((long)&uStack_548 + lVar64) = uVar54;
                                    *(uint *)((long)&uStack_548 + lVar64 + 4) = uVar55 ^ 0x80000000;
                                    auVar120._0_8_ =
                                         *(ulong *)((long)&local_540.m_dst + lVar64) ^
                                         0x8000000000000000;
                                    auVar120._8_4_ = 0;
                                    auVar120._12_4_ = 0x80000000;
                                    uVar2 = vmovlps_avx(auVar120);
                                    *(undefined8 *)((long)&local_540.m_dst + lVar64) = uVar2;
                                    lVar64 = lVar64 + 0x20;
                                  } while (lVar64 != 0x98);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"Semi-negate X:\n",0xf);
                                  poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                              (
                                                  DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *
                                                  )&local_540);
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"\n=== Use of ChTransform ===\n",
                                             0x1c);
                                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                                  std::ostream::put(-0x78);
                                  std::ostream::flush();
                                  auVar81 = _local_600;
                                  gVar78 = local_680;
                                  local_600._8_8_ = 0x4008000000000000;
                                  local_600._0_8_ = 0x4000000000000000;
                                  stack0xfffffffffffffa18 = auVar81._24_40_;
                                  auStack_5f0._0_8_ = 0x4010000000000000;
                                  local_5a0.m_dst = (DstEvaluatorType *)0x4014000000000000;
                                  local_5a0.m_src = (SrcEvaluatorType *)0x4018000000000000;
                                  local_5a0.m_functor =
                                       (assign_op<double,_double> *)0x401c000000000000;
                                  local_540.m_src = (SrcEvaluatorType *)0x3fdae2a81b75e576;
                                  local_540.m_functor =
                                       (assign_op<double,_double> *)0x3fe1ec70124e98f9;
                                  local_540.m_dstExpr = (DstXprType *)0x3fe6678c16e23f37;
                                  local_540.m_dst = (DstEvaluatorType *)0x3fc1ec70124e98f9;
                                  local_440._0_8_ = 0x4014000000000000;
                                  local_440._8_8_ = 0x4018000000000000;
                                  local_440._16_8_ = 7.0;
                                  local_440._24_8_ = 0.14002800840280097;
                                  local_440._32_8_ =
                                       (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                        *)0x3fdae2a81b75e576;
                                  local_440._40_8_ = 0.5601120336112039;
                                  local_440._48_8_ = 0.7001400420140048;
                                  local_680.m_src = (SrcEvaluatorType *)0x4021ffffffffffff;
                                  local_680.m_dst = (DstEvaluatorType *)0x401e5a5a5a5a5a5a;
                                  local_680.m_dstExpr = gVar78.m_dstExpr;
                                  local_680.m_functor =
                                       (assign_op<double,_double> *)0x40254b4b4b4b4b4a;
                                  chrono::ChTransform<double>::TransformLocalToParent
                                            ((ChVector<double> *)local_600,
                                             (ChVector<double> *)&local_5a0,
                                             (ChQuaternion<double> *)&local_540);
                                  chrono::ChCoordsys<double>::TransformLocalToParent
                                            ((ChCoordsys<double> *)local_440,
                                             (ChVector<double> *)local_600);
                                  auVar140._8_8_ = 0;
                                  auVar140._0_8_ = local_600._0_8_;
                                  auVar91._8_8_ = 0;
                                  auVar91._0_8_ = (double)local_600._8_8_ * 0.2745098039215686;
                                  auVar74 = vfmadd231sd_fma(auVar91,auVar140,
                                                            ZEXT816(0xbfe3737373737374));
                                  auVar156._8_8_ = 0;
                                  auVar156._0_8_ = auStack_5f0._0_8_;
                                  auVar74 = vfmadd231sd_fma(auVar74,auVar156,
                                                            ZEXT816(0x3fe7d7d7d7d7d7d7));
                                  auVar121._8_8_ = 0;
                                  auVar121._0_8_ = (double)local_600._8_8_ * -0.3333333333333335;
                                  auVar32 = vfmadd231sd_fma(auVar121,auVar140,
                                                            ZEXT816(0x3fe5555555555554));
                                  auVar32 = vfmadd231sd_fma(auVar32,auVar156,
                                                            ZEXT816(0x3fe5555555555554));
                                  auVar131._8_8_ = 0;
                                  auVar131._0_8_ = (double)local_600._8_8_ * 0.9019607843137254;
                                  auVar75 = vfmadd231sd_fma(auVar131,auVar140,
                                                            ZEXT816(0x3fdb9b9b9b9b9b9a));
                                  auVar75 = vfmadd231sd_fma(auVar75,auVar156,
                                                            ZEXT816(0x3f941414141413c0));
                                  auVar33._8_8_ = 0x7fffffffffffffff;
                                  auVar33._0_8_ = 0x7fffffffffffffff;
                                  auVar141._8_8_ = 0;
                                  auVar141._0_8_ = (double)local_680.m_dst - (double)local_220.m_dst
                                  ;
                                  auVar76 = vandpd_avx512vl(auVar141,auVar33);
                                  if (auVar76._0_8_ < 1e-06) {
                                    auVar34._8_8_ = 0x7fffffffffffffff;
                                    auVar34._0_8_ = 0x7fffffffffffffff;
                                    auVar142._8_8_ = 0;
                                    auVar142._0_8_ =
                                         (double)local_680.m_src - (double)local_220.m_src;
                                    auVar76 = vandpd_avx512vl(auVar142,auVar34);
                                    if (auVar76._0_8_ < 1e-06) {
                                      auVar35._8_8_ = 0x7fffffffffffffff;
                                      auVar35._0_8_ = 0x7fffffffffffffff;
                                      auVar143._8_8_ = 0;
                                      auVar143._0_8_ =
                                           (double)local_680.m_functor - (double)local_220.m_functor
                                      ;
                                      vandpd_avx512vl(auVar143,auVar35);
                                    }
                                  }
                                  local_480._0_8_ = auVar74._0_8_ + (double)local_5a0.m_dst;
                                  local_1c0._0_8_ = auVar32._0_8_ + (double)local_5a0.m_src;
                                  local_2c0._0_8_ = auVar75._0_8_ + (double)local_5a0.m_functor;
                                  poVar65 = std::ostream::_M_insert<bool>(true);
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65," ",1);
                                  auVar36._8_8_ = 0x7fffffffffffffff;
                                  auVar36._0_8_ = 0x7fffffffffffffff;
                                  auVar92._8_8_ = 0;
                                  auVar92._0_8_ = (double)local_680.m_dst - (double)local_160.m_dst;
                                  auVar74 = vandpd_avx512vl(auVar92,auVar36);
                                  if (auVar74._0_8_ < 1e-06) {
                                    auVar37._8_8_ = 0x7fffffffffffffff;
                                    auVar37._0_8_ = 0x7fffffffffffffff;
                                    auVar93._8_8_ = 0;
                                    auVar93._0_8_ =
                                         (double)local_680.m_src - (double)local_160.m_src;
                                    auVar74 = vandpd_avx512vl(auVar93,auVar37);
                                    if (auVar74._0_8_ < 1e-06) {
                                      auVar38._8_8_ = 0x7fffffffffffffff;
                                      auVar38._0_8_ = 0x7fffffffffffffff;
                                      auVar94._8_8_ = 0;
                                      auVar94._0_8_ =
                                           (double)local_680.m_functor - (double)local_160.m_functor
                                      ;
                                      vandpd_avx512vl(auVar94,auVar38);
                                    }
                                  }
                                  poVar65 = std::ostream::_M_insert<bool>(SUB81(poVar65,0));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65," ",1);
                                  auVar39._8_8_ = 0x7fffffffffffffff;
                                  auVar39._0_8_ = 0x7fffffffffffffff;
                                  auVar95._8_8_ = 0;
                                  auVar95._0_8_ = (double)local_680.m_dst - (double)local_480._0_8_;
                                  auVar74 = vandpd_avx512vl(auVar95,auVar39);
                                  if (auVar74._0_8_ < 1e-06) {
                                    auVar40._8_8_ = 0x7fffffffffffffff;
                                    auVar40._0_8_ = 0x7fffffffffffffff;
                                    auVar96._8_8_ = 0;
                                    auVar96._0_8_ =
                                         (double)local_680.m_src - (double)local_1c0._0_8_;
                                    auVar74 = vandpd_avx512vl(auVar96,auVar40);
                                    if (auVar74._0_8_ < 1e-06) {
                                      auVar41._8_8_ = 0x7fffffffffffffff;
                                      auVar41._0_8_ = 0x7fffffffffffffff;
                                      auVar97._8_8_ = 0;
                                      auVar97._0_8_ =
                                           (double)local_680.m_functor - (double)local_2c0._0_8_;
                                      vandpd_avx512vl(auVar97,auVar41);
                                    }
                                  }
                                  poVar65 = std::ostream::_M_insert<bool>(SUB81(poVar65,0));
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  chrono::ChTransform<double>::TransformParentToLocal
                                            ((ChVector<double> *)&local_680,
                                             (ChVector<double> *)&local_5a0,
                                             (ChQuaternion<double> *)&local_540);
                                  local_490 = (double)local_680.m_dst - (double)local_5a0.m_dst;
                                  local_238 = (double)local_680.m_src - (double)local_5a0.m_src;
                                  local_230 = (double)local_680.m_functor -
                                              (double)local_5a0.m_functor;
                                  local_248 = local_238 * 0.6666666666666665;
                                  local_1c0._0_8_ = 0xbfe3737373737374;
                                  auVar132._8_8_ = 0;
                                  auVar132._0_8_ = local_490;
                                  auVar144._8_8_ = 0;
                                  auVar144._0_8_ = local_248;
                                  auVar74 = vfmadd213sd_fma(ZEXT816(0xbfe3737373737374),auVar132,
                                                            auVar144);
                                  local_480._0_8_ = 0x3fdb9b9b9b9b9b9a;
                                  auVar122._8_8_ = 0;
                                  auVar122._0_8_ = local_230;
                                  auVar74 = vfmadd231sd_fma(auVar74,auVar122,
                                                            ZEXT816(0x3fdb9b9b9b9b9b9a));
                                  local_608 = auVar74._0_8_;
                                  chrono::ChCoordsys<double>::TransformParentToLocal
                                            ((ChCoordsys<double> *)local_440,
                                             (ChVector<double> *)&local_680);
                                  local_610 = (double)local_680.m_dst - (double)local_5a0.m_dst;
                                  local_618 = (double)local_680.m_src - (double)local_5a0.m_src;
                                  local_240 = local_618 * 0.6666666666666665;
                                  auVar42._8_8_ = 0x7fffffffffffffff;
                                  auVar42._0_8_ = 0x7fffffffffffffff;
                                  auVar123._8_8_ = 0;
                                  auVar123._0_8_ = (double)local_600._0_8_ - (double)local_100._0_8_
                                  ;
                                  auVar74 = vandpd_avx512vl(auVar123,auVar42);
                                  if (auVar74._0_8_ < 1e-06) {
                                    auVar43._8_8_ = 0x7fffffffffffffff;
                                    auVar43._0_8_ = 0x7fffffffffffffff;
                                    auVar124._8_8_ = 0;
                                    auVar124._0_8_ =
                                         (double)local_600._8_8_ - (double)local_100._8_8_;
                                    auVar74 = vandpd_avx512vl(auVar124,auVar43);
                                    if (auVar74._0_8_ < 1e-06) {
                                      auVar44._8_8_ = 0x7fffffffffffffff;
                                      auVar44._0_8_ = 0x7fffffffffffffff;
                                      auVar125._8_8_ = 0;
                                      auVar125._0_8_ = (double)auStack_5f0._0_8_ - dStack_f0;
                                      vandpd_avx512vl(auVar125,auVar44);
                                    }
                                  }
                                  local_2c0._0_8_ =
                                       (double)local_680.m_functor - (double)local_5a0.m_functor;
                                  auVar98._8_8_ = 0;
                                  auVar98._0_8_ = local_1c0._0_8_;
                                  auVar145._8_8_ = 0;
                                  auVar145._0_8_ = local_610;
                                  auVar157._8_8_ = 0;
                                  auVar157._0_8_ = local_240;
                                  auVar74 = vfmadd213sd_fma(auVar98,auVar145,auVar157);
                                  local_1c0._0_8_ = auVar74._0_8_;
                                  poVar65 = std::ostream::_M_insert<bool>(true);
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65," ",1);
                                  auVar45._8_8_ = 0x7fffffffffffffff;
                                  auVar45._0_8_ = 0x7fffffffffffffff;
                                  auVar99._8_8_ = 0;
                                  auVar99._0_8_ = (double)local_600._0_8_ - (double)local_608;
                                  auVar74 = vandpd_avx512vl(auVar99,auVar45);
                                  if (auVar74._0_8_ < 1e-06) {
                                    auVar146._8_8_ = 0;
                                    auVar146._0_8_ = local_490;
                                    auVar100._8_8_ = 0;
                                    auVar100._0_8_ = local_238 * -0.3333333333333335;
                                    auVar74 = vfmadd231sd_fma(auVar100,auVar146,
                                                              ZEXT816(0x3fd1919191919191));
                                    auVar158._8_8_ = 0;
                                    auVar158._0_8_ = local_230;
                                    auVar74 = vfmadd231sd_fma(auVar74,auVar158,
                                                              ZEXT816(0x3fecdcdcdcdcdcdc));
                                    auVar46._8_8_ = 0x7fffffffffffffff;
                                    auVar46._0_8_ = 0x7fffffffffffffff;
                                    auVar101._8_8_ = 0;
                                    auVar101._0_8_ = (double)local_600._8_8_ - auVar74._0_8_;
                                    auVar74 = vandpd_avx512vl(auVar101,auVar46);
                                    if (auVar74._0_8_ < 1e-06) {
                                      auVar102._8_8_ = 0;
                                      auVar102._0_8_ = local_248;
                                      auVar74 = vfmadd132sd_fma(auVar146,auVar102,
                                                                ZEXT816(0x3fe7d7d7d7d7d7d7));
                                      auVar74 = vfmadd132sd_fma(auVar158,auVar74,
                                                                ZEXT816(0x3f941414141413c0));
                                      auVar47._8_8_ = 0x7fffffffffffffff;
                                      auVar47._0_8_ = 0x7fffffffffffffff;
                                      auVar103._8_8_ = 0;
                                      auVar103._0_8_ = (double)auStack_5f0._0_8_ - auVar74._0_8_;
                                      vandpd_avx512vl(auVar103,auVar47);
                                    }
                                  }
                                  auVar126._8_8_ = 0;
                                  auVar126._0_8_ = local_2c0._0_8_;
                                  auVar104._8_8_ = 0;
                                  auVar104._0_8_ = local_480._0_8_;
                                  auVar24._8_8_ = 0;
                                  auVar24._0_8_ = local_1c0._0_8_;
                                  auVar74 = vfmadd213sd_fma(auVar104,auVar126,auVar24);
                                  local_480._0_8_ = auVar74._0_8_;
                                  poVar65 = std::ostream::_M_insert<bool>(SUB81(poVar65,0));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65," ",1);
                                  auVar48._8_8_ = 0x7fffffffffffffff;
                                  auVar48._0_8_ = 0x7fffffffffffffff;
                                  auVar105._8_8_ = 0;
                                  auVar105._0_8_ = (double)local_600._0_8_ - local_308;
                                  auVar74 = vandpd_avx512vl(auVar105,auVar48);
                                  if (auVar74._0_8_ < 1e-06) {
                                    auVar49._8_8_ = 0x7fffffffffffffff;
                                    auVar49._0_8_ = 0x7fffffffffffffff;
                                    auVar106._8_8_ = 0;
                                    auVar106._0_8_ = (double)local_600._8_8_ - local_300;
                                    auVar74 = vandpd_avx512vl(auVar106,auVar49);
                                    if (auVar74._0_8_ < 1e-06) {
                                      auVar50._8_8_ = 0x7fffffffffffffff;
                                      auVar50._0_8_ = 0x7fffffffffffffff;
                                      auVar107._8_8_ = 0;
                                      auVar107._0_8_ = (double)auStack_5f0._0_8_ - local_2f8;
                                      vandpd_avx512vl(auVar107,auVar50);
                                    }
                                  }
                                  poVar65 = std::ostream::_M_insert<bool>(SUB81(poVar65,0));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar65," ",1);
                                  auVar51._8_8_ = 0x7fffffffffffffff;
                                  auVar51._0_8_ = 0x7fffffffffffffff;
                                  auVar108._8_8_ = 0;
                                  auVar108._0_8_ = (double)local_600._0_8_ - (double)local_480._0_8_
                                  ;
                                  auVar74 = vandpd_avx512vl(auVar108,auVar51);
                                  if (auVar74._0_8_ < 1e-06) {
                                    auVar133._8_8_ = 0;
                                    auVar133._0_8_ = local_610;
                                    auVar109._8_8_ = 0;
                                    auVar109._0_8_ = local_618 * -0.3333333333333335;
                                    auVar74 = vfmadd213sd_fma(ZEXT816(0x3fd1919191919191),auVar133,
                                                              auVar109);
                                    auVar147._8_8_ = 0;
                                    auVar147._0_8_ = local_2c0._0_8_;
                                    auVar74 = vfmadd213sd_fma(ZEXT816(0x3fecdcdcdcdcdcdc),auVar147,
                                                              auVar74);
                                    auVar52._8_8_ = 0x7fffffffffffffff;
                                    auVar52._0_8_ = 0x7fffffffffffffff;
                                    auVar110._8_8_ = 0;
                                    auVar110._0_8_ = (double)local_600._8_8_ - auVar74._0_8_;
                                    auVar74 = vandpd_avx512vl(auVar110,auVar52);
                                    if (auVar74._0_8_ < 1e-06) {
                                      auVar25._8_8_ = 0;
                                      auVar25._0_8_ = local_240;
                                      auVar74 = vfmadd213sd_fma(ZEXT816(0x3fe7d7d7d7d7d7d7),auVar133
                                                                ,auVar25);
                                      auVar74 = vfmadd213sd_fma(ZEXT816(0x3f941414141413c0),auVar147
                                                                ,auVar74);
                                      auVar53._8_8_ = 0x7fffffffffffffff;
                                      auVar53._0_8_ = 0x7fffffffffffffff;
                                      auVar111._8_8_ = 0;
                                      auVar111._0_8_ = (double)auStack_5f0._0_8_ - auVar74._0_8_;
                                      vandpd_avx512vl(auVar111,auVar53);
                                    }
                                  }
                                  poVar65 = std::ostream::_M_insert<bool>(SUB81(poVar65,0));
                                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar65 + -0x18) +
                                                  (char)poVar65);
                                  std::ostream::put((char)poVar65);
                                  std::ostream::flush();
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,"\n=== Linear systems ===\n",0x18
                                            );
                                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
                                  std::ostream::put(-0x78);
                                  std::ostream::flush();
                                  local_440._8_8_ = 0.0;
                                  local_440._16_8_ =
                                       (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                        *)0x1;
                                  local_440._24_8_ = 4.94065645841247e-324;
                                  local_540.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
                                  local_5a0.m_dst = (DstEvaluatorType *)0x4000000000000000;
                                  local_440._0_8_ = &local_540;
                                  pCVar69 = Eigen::
                                            CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                            ::operator_((
                                                  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                  *)local_440,(Scalar *)&local_5a0);
                                  local_680.m_dst = (DstEvaluatorType *)0x4008000000000000;
                                  pCVar69 = Eigen::
                                            CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                            ::operator_(pCVar69,(Scalar *)&local_680);
                                  local_220.m_dst = (DstEvaluatorType *)0x4010000000000000;
                                  pCVar69 = Eigen::
                                            CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                            ::operator_(pCVar69,(Scalar *)&local_220);
                                  local_160.m_dst = (DstEvaluatorType *)0x4014000000000000;
                                  pCVar69 = Eigen::
                                            CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                            ::operator_(pCVar69,(Scalar *)&local_160);
                                  local_100._0_8_ = 0x4018000000000000;
                                  pCVar69 = Eigen::
                                            CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                            ::operator_(pCVar69,(Scalar *)local_100);
                                  local_308 = 7.0;
                                  pCVar69 = Eigen::
                                            CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                            ::operator_(pCVar69,&local_308);
                                  local_90[0].m_data[0] = 8.0;
                                  pCVar69 = Eigen::
                                            CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                            ::operator_(pCVar69,local_90[0].m_data);
                                  local_228.data = (double *)0x4024000000000000;
                                  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::
                                  operator_(pCVar69,(Scalar *)&local_228);
                                  if ((local_440._24_8_ + local_440._8_8_ == 3) &&
                                     ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                       *)local_440._16_8_ ==
                                      (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                       *)0x3)) {
                                    local_440._8_8_ = 0.0;
                                    local_440._16_8_ =
                                         (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                          *)0x1;
                                    local_440._24_8_ = 4.94065645841247e-324;
                                    local_600._0_8_ = 0x4008000000000000;
                                    local_5a0.m_dst = (DstEvaluatorType *)0x4008000000000000;
                                    local_440._0_8_ =
                                         (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                          *)local_600;
                                    this = Eigen::
                                           CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::
                                           operator_((
                                                  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                                  *)local_440,(Scalar *)&local_5a0);
                                    local_680.m_dst = (DstEvaluatorType *)0x4010000000000000;
                                    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::
                                    operator_(this,(Scalar *)&local_680);
                                    if ((local_440._24_8_ + local_440._8_8_ == 3) &&
                                       ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                         *)local_440._16_8_ ==
                                        (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                                         *)0x1)) {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,"matrix A:\n",10);
                                      poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                                  (
                                                  DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *
                                                  )&local_540);
                                      std::ios::widen((char)*(undefined8 *)
                                                             (*(long *)poVar65 + -0x18) +
                                                      (char)poVar65);
                                      std::ostream::put((char)poVar65);
                                      std::ostream::flush();
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,"vector b:\n",10);
                                      poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                                  (
                                                  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *
                                                  )local_600);
                                      std::ios::widen((char)*(undefined8 *)
                                                             (*(long *)poVar65 + -0x18) +
                                                      (char)poVar65);
                                      std::ostream::put((char)poVar65);
                                      std::ostream::flush();
                                      local_370 = local_370 & 0xffffffffffff0000;
                                      local_440._48_8_ = CONCAT44(uStack_50c,uStack_510);
                                      local_440._56_8_ = CONCAT44(uStack_504,uStack_508);
                                      local_440._0_8_ = local_540.m_dst;
                                      local_440._8_8_ = local_540.m_src;
                                      local_440._16_8_ = local_540.m_functor;
                                      local_440._24_8_ = local_540.m_dstExpr;
                                      local_440._32_8_ = pdStack_520;
                                      local_440._40_8_ = pdStack_518;
                                      local_440._64_8_ = local_500;
                                      Eigen::
                                      ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::
                                      computeInPlace((
                                                  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                                  *)local_440);
                                      if (local_370._0_1_ == false) {
                                        __assert_fail(
                                                  "derived().m_isInitialized && \"Solver is not initialized.\""
                                                  ,"/usr/include/eigen3/Eigen/src/Core/SolverBase.h"
                                                  ,0x96,
                                                  "void Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, 3, 1>>>::_check_solve_assertion(const Rhs &) const [Derived = Eigen::ColPivHouseholderQR<Eigen::Matrix<double, 3, 3, 1>>, Transpose_ = false, Rhs = Eigen::MatrixBase<Eigen::Matrix<double, 3, 1>>]"
                                                  );
                                      }
                                      Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>>::
                                      _solve_impl<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
                                                ((ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>>
                                                  *)local_440,
                                                 (Matrix<double,_3,_1,_0,_3,_1> *)local_600,
                                                 (Matrix<double,_3,_1,_0,_3,_1> *)&local_5a0);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,"solution:\n",10);
                                      poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                                  (
                                                  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *
                                                  )&local_5a0);
                                      std::ios::widen((char)*(undefined8 *)
                                                             (*(long *)poVar65 + -0x18) +
                                                      (char)poVar65);
                                      std::ostream::put((char)poVar65);
                                      std::ostream::flush();
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,"Ax-b:\n",6);
                                      local_440._0_8_ = &local_540;
                                      local_440._8_8_ = &local_5a0;
                                      local_440._16_8_ = (Matrix<double,_3,_1,_0,_3,_1> *)local_600;
                                      poVar65 = Eigen::operator<<((ostream *)&std::cout,
                                                                  (
                                                  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                                  *)local_440);
                                      std::ios::widen((char)*(undefined8 *)
                                                             (*(long *)poVar65 + -0x18) +
                                                      (char)poVar65);
                                      std::ostream::put((char)poVar65);
                                      std::ostream::flush();
                                      return 0;
                                    }
                                    pcVar71 = 
                                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
                                    ;
                                  }
                                  else {
                                    pcVar71 = 
                                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3, 1>]"
                                    ;
                                  }
                                  goto LAB_00107e5a;
                                }
                              }
                              __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                                            "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 2, 3>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 2, BlockCols = 3, InnerPanel = false]"
                                           );
                            }
                            pcVar71 = 
                            "XprType &Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double, 5, 7, 1>, 2, 3>>::finished() [MatrixType = Eigen::Block<Eigen::Matrix<double, 5, 7, 1>, 2, 3>]"
                            ;
                          }
                          else {
                            pcVar71 = 
                            "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 2, 3, 1>]"
                            ;
                          }
                          goto LAB_00107e5a;
                        }
                        goto LAB_00107b3d;
                      }
                      goto LAB_00107b23;
                    }
                  }
                  pcVar71 = 
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                  ;
                  goto LAB_00107c43;
                }
              }
              pcVar71 = 
              "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
              ;
LAB_00107e5a:
              __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                            ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar71);
            }
          }
          pcVar71 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, 2, 3, 1>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, 2, 3, 1>, Rhs = const Eigen::Matrix<double, -1, -1, 1>]"
          ;
LAB_00107d66:
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar71);
        }
        goto LAB_00107b3d;
      }
    }
    pcVar71 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
    ;
  }
LAB_00107c43:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar71);
}

Assistant:

int main(int argc, char* argv[]) {
    ///! [Basic operations with matrices]
    std::cout << "\n=== Creation and assignment ===\n" << std::endl;
    {
        // Matrix allocated on the heap.
        chrono::ChMatrixDynamic<> Md1(5, 7);
        chrono::ChMatrixDynamic<> Md2(4, 4);

        // Matrix allocated on the stack.
        chrono::ChMatrixNM<double, 4, 4> Ms;

        // 3x3 matrices, mostly used for coordinate transformations.
        chrono::ChMatrix33<> ma;

        Ms.setConstant(0.1);  // Fill a matrix with an element
        std::cout << Ms << std::endl;

        Md1.setRandom();         // initialize with random numbers
        Md1.transposeInPlace();  // transpose the matrix in place
        Md1.resize(2, 2);        // resize
        Md1.setZero();           // set all elements to zero

        Md2.setIdentity();  // Create a diagonal matrix
        Md2 *= 3;

        Md2(0, 0) = 10;  // Use the () operator to reference single elements
        Md2(1, 2) = Md2(0, 0) + Md2(1, 1);
        Md2(2, 2) = 4;

        chrono::ChMatrixDynamic<> M1(Md2);   // Copy constructor
        chrono::ChMatrixDynamic<> M2(-Ms);   // The - unary operator returns a negated matrix
        chrono::ChMatrixDynamic<> M3(8, 4);  // 8x4 uninitialized matrix
        M3 = M1;                             // Copy (resize as needed)
        M3 = M1.transpose();                 // transposed copy.
    }

    std::cout << "\n=== Matrix operations ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 2, 3> A;
        chrono::ChMatrixDynamic<double> B(2, 3);
        A.setRandom();
        B.setRandom();
        chrono::ChMatrixDynamic<> result(A + B);
        result = A + B;
        result = A;
        result += B;

        // Different ways to do subtraction..
        result = A - B;
        result = A;
        result -= B;

        // Multiplication with scalar
        result = A * 10;
        result = 10 * A;
        std::cout << result << std::endl;

        result = A;
        result *= 10;
        std::cout << result << std::endl;

        // Matrix multiplications
        chrono::ChMatrixDynamic<> C(3, 2);
        chrono::ChMatrixDynamic<> D(2, 3);
        chrono::ChMatrixDynamic<double> CD = C * D;
        chrono::ChMatrixDynamic<double> CD_t = D.transpose() * C.transpose();

        chrono::ChMatrix33<> R(chrono::Q_from_AngX(chrono::CH_C_PI / 3));
        std::cout << "rot * matrix\n" << R * C << std::endl;
        std::cout << "matrix * rot\n" << D * R << std::endl;
    }

    std::cout << "\n=== Chrono extensions to Eigen::MatrixBase ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 2, 3> A;
        A.setRandom();
        std::cout << "random 2x3 matrix A:\n" << A << std::endl;
        A.fillDiagonal(10.1);
        std::cout << "fill diagonal with 10.1:\n" << A << std::endl;
        A.fill(2.1);
        std::cout << "fill entire matrix with 2.1:\n" << A << std::endl;

        chrono::ChMatrixNM<double, 2, 3> B(A);
        B(1, 2) += 0.01;
        std::cout << "matrix B = A with B(1,2) incremented by 0.01\n" << B << std::endl;
        std::cout << "|A-B| < 0.1?   " << A.equals(B, 0.1) << std::endl;
        std::cout << "|A-B| < 0.001? " << A.equals(B, 0.001) << std::endl;

        chrono::ChVectorDynamic<> v(3);
        v << 2, 3, 4;
        chrono::ChVectorDynamic<> w(3);
        w << 0.1, 0.2, 0.3;
        std::cout << "||v||_wrms, w = " << v.wrmsNorm(w) << std::endl;
        std::cout << "||v + v||_wrms, w = " << (v + v).wrmsNorm(w) << std::endl;

        std::cout << "v + v + 1: " << (v + v) + 1 << std::endl;
        std::cout << "1 + v: " << 1 + v << std::endl;
    }

    std::cout << "\n=== Matrix comparison tests ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 2, 3> A;
        A.setRandom();
        chrono::ChMatrixDynamic<> B(A);
        if (A == B) {
            std::cout << "Matrices are exactly equal" << std::endl;
        }

        // Tolerance comparison
        B(1, 2) += 0.001;
        if (A.equals(B, 0.002)) {
            std::cout << "Matrices are equal within tol 0.002 \n";
        }
    }

    std::cout << "\n=== Pasting matrices and matrix-blocks ===\n" << std::endl;
    {
        chrono::ChMatrixDynamic<> A(4, 6);
        A.setRandom();
        std::cout << A << "\n\n";

        chrono::ChMatrixNM<double, 2, 3> B;
        B << 1, 2, 3, 4, 5, 6;
        std::cout << B << "\n\n";

        chrono::ChMatrixNM<double, 5, 7> C;
        C.setZero();
        C.block<2, 3>(1, 1) << 10, 20, 30, 40, 50, 60;
        std::cout << C << "\n\n";

        chrono::ChMatrixDynamic<> X = A;
        X.block<2, 3>(1, 2) = B;
        std::cout << X << "\n\n";

        X.block<2, 3>(1, 2) += C.block<2, 3>(1, 1);
        std::cout << X << "\n\n";
    }

    std::cout << "\n=== 3x3 matrix times vector ===\n" << std::endl;
    {
        chrono::ChVector<> v(1, 2, 3);
        chrono::ChMatrix33<> A;
        A.setRandom();

        chrono::ChMatrix33<> B(1);
        std::cout << B << std::endl;

        // Vector transformation, typical product [A] * v
        chrono::ChVector<> res1 = A * v;

        // Inverse vector transformation, [A]' * v
        chrono::ChVector<> res2 = A.transpose() * v;

        std::cout << A << std::endl;
        std::cout << res1 << std::endl;
        std::cout << res2 << std::endl;
    }

    std::cout << "\n=== Custom 3x4, 4x3, and 4x4 matrices ===\n" << std::endl;
    {
        chrono::ChMatrix34<> G = Eigen::Matrix<double, 3, 4>::Ones(3, 4);
        chrono::ChQuaternion<> q(1, 2, 3, 4);
        chrono::ChVector<> v = G * q;
        std::cout << v << std::endl;

        chrono::ChMatrix43<> Gt = 2 * G.transpose();
        std::cout << Gt << std::endl;
        q = Gt * v;
        std::cout << q << std::endl;
        q = G.transpose() * v;
        std::cout << q << std::endl;

        chrono::ChMatrix33<> rot(chrono::Q_from_AngX(chrono::CH_C_PI / 6));
        std::cout << rot << std::endl;
        std::cout << rot.transpose() << std::endl;

        chrono::ChMatrix34<> res1 = rot * G;
        chrono::ChMatrix34<> res2 = rot * Gt.transpose();
        chrono::ChMatrix43<> res3 = Gt * rot;
        chrono::ChMatrix43<> res4 = G.transpose() * rot;
        std::cout << "rot * G:\n" << res1 << std::endl;
        std::cout << "rot * (G').transpose:\n" << res2 << std::endl;
        std::cout << "G' * rot:\n" << res3 << std::endl;
        std::cout << "G.transpose * rot:\n" << res4 << std::endl;

        chrono::ChMatrix44<> A44;
        A44.setRandom();
        chrono::ChQuaternion<> q2 = A44 * q;
        std::cout << "Random 4x4 * q:\n" << q2 << std::endl; 

        chrono::ChStarMatrix44<> X(chrono::ChQuaternion<>(1, 2, 3, 4));
        std::cout << "4x4 star matrix X:\n" << X << std::endl;
        X.semiTranspose();
        std::cout << "Semi-transpose X:\n" << X << std::endl;
        X.semiNegate();
        std::cout << "Semi-negate X:\n" << X << std::endl;
    }

    std::cout << "\n=== Use of ChTransform ===\n" << std::endl;
    {
        chrono::ChVector<> vl(2, 3, 4);        // local point to transform
        chrono::ChVector<> t(5, 6, 7);         // translation of coord system
        chrono::ChQuaternion<> q(1, 3, 4, 5);  // rotation of coord system (quaternion)
        q.Normalize();                         // as unit quaternion, must be normalized
        chrono::ChMatrix33<> R;                // rotation of coord system (rotation matrix)
        R.Set_A_quaternion(q);                 // set from quaternion
        chrono::Coordsys csys(t, q);           // coordinate system representing translation + rotation

        // Perform the transformation: v = t + [R] * v'
        // NOTE: all the following ways will give the same result, so you can use them equivalently!
        auto va1 = chrono::ChTransform<>::TransformLocalToParent(vl, t, R);
        auto va2 = chrono::ChTransform<>::TransformLocalToParent(vl, t, q);
        auto va3 = csys.TransformLocalToParent(vl);
        auto va4 = t + R * vl;
        std::cout << va2.Equals(va1, 1e-6) << " " << va3.Equals(va1, 1e-6) << " " << va4.Equals(va1, 1e-6) << std::endl;

        // Inverse transformation
        auto vl1 = chrono::ChTransform<>::TransformParentToLocal(va1, t, q);
        auto vl2 = chrono::ChTransform<>::TransformParentToLocal(va1, t, R);
        auto vl3 = csys.TransformParentToLocal(va1);
        auto vl4 = R.transpose() * (va1 - t);
        std::cout << vl1.Equals(vl, 1e-6) << " " << vl2.Equals(vl, 1e-6) << " " << vl3.Equals(vl, 1e-6) << " "
                  << vl4.Equals(vl, 1e-6) << std::endl;
    }

    std::cout << "\n=== Linear systems ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 3, 3> A;
        Eigen::Vector3d b;
        A << 1, 2, 3, 4, 5, 6, 7, 8, 10;
        b << 3, 3, 4;
        std::cout << "matrix A:\n" << A << std::endl;
        std::cout << "vector b:\n" << b << std::endl;
        Eigen::Vector3d x = A.colPivHouseholderQr().solve(b);
        std::cout << "solution:\n" << x << std::endl;
        std::cout << "Ax-b:\n" << A * x - b << std::endl;
    }
    ///! [Basic operations with matrices]

    return 0;
}